

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  byte bVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar39;
  uint uVar40;
  long lVar41;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  bool bVar45;
  bool bVar46;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  int iVar107;
  float t1;
  float fVar108;
  undefined1 auVar109 [16];
  float fVar110;
  float fVar111;
  undefined4 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  vfloat4 b0_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar167 [16];
  undefined1 auVar179 [32];
  vfloat4 a0_3;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  vfloat4 a0_2;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar211;
  float fVar212;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar228;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  vfloat4 a0;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  vfloat4 a0_1;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  int iVar258;
  undefined1 in_ZMM31 [64];
  undefined1 auVar259 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5c1;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3d0 [8];
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar38;
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar242 [32];
  
  PVar6 = prim[1];
  uVar37 = (ulong)(byte)PVar6;
  fVar216 = *(float *)(prim + uVar37 * 0x19 + 0x12);
  auVar47 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar59 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar50 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar48 = vsubps_avx(auVar47,*(undefined1 (*) [16])(prim + uVar37 * 0x19 + 6));
  fVar131 = fVar216 * auVar48._0_4_;
  fVar108 = fVar216 * auVar50._0_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar37 * 4 + 6);
  auVar80 = vpmovsxbd_avx2(auVar47);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar37 * 5 + 6);
  auVar78 = vpmovsxbd_avx2(auVar59);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar37 * 6 + 6);
  auVar79 = vpmovsxbd_avx2(auVar3);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar37 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar58);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar91 = vpmovsxbd_avx2(auVar57);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar37 + 6);
  auVar81 = vpmovsxbd_avx2(auVar56);
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar44 = (ulong)(uint)((int)(uVar37 * 9) * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar44 + 6);
  auVar82 = vpmovsxbd_avx2(auVar4);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar44 + uVar37 + 6);
  auVar85 = vpmovsxbd_avx2(auVar55);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vcvtdq2ps_avx(auVar85);
  uVar42 = (ulong)(uint)((int)(uVar37 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar42 + 6);
  auVar76 = vpmovsxbd_avx2(auVar5);
  auVar84 = vcvtdq2ps_avx(auVar76);
  auVar138._4_4_ = fVar108;
  auVar138._0_4_ = fVar108;
  auVar138._8_4_ = fVar108;
  auVar138._12_4_ = fVar108;
  auVar138._16_4_ = fVar108;
  auVar138._20_4_ = fVar108;
  auVar138._24_4_ = fVar108;
  auVar138._28_4_ = fVar108;
  auVar249._8_4_ = 1;
  auVar249._0_8_ = 0x100000001;
  auVar249._12_4_ = 1;
  auVar249._16_4_ = 1;
  auVar249._20_4_ = 1;
  auVar249._24_4_ = 1;
  auVar249._28_4_ = 1;
  auVar86 = ZEXT1632(CONCAT412(fVar216 * auVar50._12_4_,
                               CONCAT48(fVar216 * auVar50._8_4_,
                                        CONCAT44(fVar216 * auVar50._4_4_,fVar108))));
  auVar77 = vpermps_avx2(auVar249,auVar86);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar256 = ZEXT3264(auVar74);
  auVar75 = vpermps_avx512vl(auVar74,auVar86);
  fVar108 = auVar75._0_4_;
  fVar215 = auVar75._4_4_;
  auVar86._4_4_ = fVar215 * auVar79._4_4_;
  auVar86._0_4_ = fVar108 * auVar79._0_4_;
  fVar200 = auVar75._8_4_;
  auVar86._8_4_ = fVar200 * auVar79._8_4_;
  fVar211 = auVar75._12_4_;
  auVar86._12_4_ = fVar211 * auVar79._12_4_;
  fVar212 = auVar75._16_4_;
  auVar86._16_4_ = fVar212 * auVar79._16_4_;
  fVar110 = auVar75._20_4_;
  auVar86._20_4_ = fVar110 * auVar79._20_4_;
  fVar111 = auVar75._24_4_;
  auVar86._24_4_ = fVar111 * auVar79._24_4_;
  auVar86._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar81._4_4_ * fVar215;
  auVar85._0_4_ = auVar81._0_4_ * fVar108;
  auVar85._8_4_ = auVar81._8_4_ * fVar200;
  auVar85._12_4_ = auVar81._12_4_ * fVar211;
  auVar85._16_4_ = auVar81._16_4_ * fVar212;
  auVar85._20_4_ = auVar81._20_4_ * fVar110;
  auVar85._24_4_ = auVar81._24_4_ * fVar111;
  auVar85._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar84._4_4_ * fVar215;
  auVar76._0_4_ = auVar84._0_4_ * fVar108;
  auVar76._8_4_ = auVar84._8_4_ * fVar200;
  auVar76._12_4_ = auVar84._12_4_ * fVar211;
  auVar76._16_4_ = auVar84._16_4_ * fVar212;
  auVar76._20_4_ = auVar84._20_4_ * fVar110;
  auVar76._24_4_ = auVar84._24_4_ * fVar111;
  auVar76._28_4_ = auVar75._28_4_;
  auVar47 = vfmadd231ps_fma(auVar86,auVar77,auVar78);
  auVar59 = vfmadd231ps_fma(auVar85,auVar77,auVar91);
  auVar3 = vfmadd231ps_fma(auVar76,auVar83,auVar77);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar138,auVar80);
  auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar138,auVar90);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar82,auVar138);
  auVar145._4_4_ = fVar131;
  auVar145._0_4_ = fVar131;
  auVar145._8_4_ = fVar131;
  auVar145._12_4_ = fVar131;
  auVar145._16_4_ = fVar131;
  auVar145._20_4_ = fVar131;
  auVar145._24_4_ = fVar131;
  auVar145._28_4_ = fVar131;
  auVar76 = ZEXT1632(CONCAT412(fVar216 * auVar48._12_4_,
                               CONCAT48(fVar216 * auVar48._8_4_,
                                        CONCAT44(fVar216 * auVar48._4_4_,fVar131))));
  auVar85 = vpermps_avx2(auVar249,auVar76);
  auVar76 = vpermps_avx512vl(auVar74,auVar76);
  auVar77 = vmulps_avx512vl(auVar76,auVar79);
  auVar88._0_4_ = auVar76._0_4_ * auVar81._0_4_;
  auVar88._4_4_ = auVar76._4_4_ * auVar81._4_4_;
  auVar88._8_4_ = auVar76._8_4_ * auVar81._8_4_;
  auVar88._12_4_ = auVar76._12_4_ * auVar81._12_4_;
  auVar88._16_4_ = auVar76._16_4_ * auVar81._16_4_;
  auVar88._20_4_ = auVar76._20_4_ * auVar81._20_4_;
  auVar88._24_4_ = auVar76._24_4_ * auVar81._24_4_;
  auVar88._28_4_ = 0;
  auVar81._4_4_ = auVar76._4_4_ * auVar84._4_4_;
  auVar81._0_4_ = auVar76._0_4_ * auVar84._0_4_;
  auVar81._8_4_ = auVar76._8_4_ * auVar84._8_4_;
  auVar81._12_4_ = auVar76._12_4_ * auVar84._12_4_;
  auVar81._16_4_ = auVar76._16_4_ * auVar84._16_4_;
  auVar81._20_4_ = auVar76._20_4_ * auVar84._20_4_;
  auVar81._24_4_ = auVar76._24_4_ * auVar84._24_4_;
  auVar81._28_4_ = auVar79._28_4_;
  auVar78 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar78);
  auVar58 = vfmadd231ps_fma(auVar88,auVar85,auVar91);
  auVar57 = vfmadd231ps_fma(auVar81,auVar85,auVar83);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar145,auVar80);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar145,auVar90);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar145,auVar82);
  auVar92._8_4_ = 0x7fffffff;
  auVar92._0_8_ = 0x7fffffff7fffffff;
  auVar92._12_4_ = 0x7fffffff;
  auVar92._16_4_ = 0x7fffffff;
  auVar92._20_4_ = 0x7fffffff;
  auVar92._24_4_ = 0x7fffffff;
  auVar92._28_4_ = 0x7fffffff;
  auVar80 = vandps_avx(ZEXT1632(auVar47),auVar92);
  auVar94._8_4_ = 0x219392ef;
  auVar94._0_8_ = 0x219392ef219392ef;
  auVar94._12_4_ = 0x219392ef;
  auVar94._16_4_ = 0x219392ef;
  auVar94._20_4_ = 0x219392ef;
  auVar94._24_4_ = 0x219392ef;
  auVar94._28_4_ = 0x219392ef;
  uVar44 = vcmpps_avx512vl(auVar80,auVar94,1);
  bVar45 = (bool)((byte)uVar44 & 1);
  auVar77._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar47._0_4_;
  bVar45 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar47._4_4_;
  bVar45 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar47._8_4_;
  bVar45 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar47._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar80 = vandps_avx(ZEXT1632(auVar59),auVar92);
  uVar44 = vcmpps_avx512vl(auVar80,auVar94,1);
  bVar45 = (bool)((byte)uVar44 & 1);
  auVar74._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar59._0_4_;
  bVar45 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar59._4_4_;
  bVar45 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar59._8_4_;
  bVar45 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar59._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar80 = vandps_avx(ZEXT1632(auVar3),auVar92);
  uVar44 = vcmpps_avx512vl(auVar80,auVar94,1);
  bVar45 = (bool)((byte)uVar44 & 1);
  auVar80._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar3._0_4_;
  bVar45 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar3._4_4_;
  bVar45 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar3._8_4_;
  bVar45 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * auVar3._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar93._8_4_ = 0x3f800000;
  auVar93._0_8_ = &DAT_3f8000003f800000;
  auVar93._12_4_ = 0x3f800000;
  auVar93._16_4_ = 0x3f800000;
  auVar93._20_4_ = 0x3f800000;
  auVar93._24_4_ = 0x3f800000;
  auVar93._28_4_ = 0x3f800000;
  auVar47 = vfnmadd213ps_fma(auVar77,auVar79,auVar93);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar74);
  auVar59 = vfnmadd213ps_fma(auVar74,auVar79,auVar93);
  auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar80);
  auVar3 = vfnmadd213ps_fma(auVar80,auVar79,auVar93);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar79,auVar79);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 7 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vsubps_avx512vl(auVar80,auVar78);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 9 + 6));
  auVar82._4_4_ = auVar47._4_4_ * auVar79._4_4_;
  auVar82._0_4_ = auVar47._0_4_ * auVar79._0_4_;
  auVar82._8_4_ = auVar47._8_4_ * auVar79._8_4_;
  auVar82._12_4_ = auVar47._12_4_ * auVar79._12_4_;
  auVar82._16_4_ = auVar79._16_4_ * 0.0;
  auVar82._20_4_ = auVar79._20_4_ * 0.0;
  auVar82._24_4_ = auVar79._24_4_ * 0.0;
  auVar82._28_4_ = auVar79._28_4_;
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx512vl(auVar80,auVar78);
  auVar89._0_4_ = auVar47._0_4_ * auVar80._0_4_;
  auVar89._4_4_ = auVar47._4_4_ * auVar80._4_4_;
  auVar89._8_4_ = auVar47._8_4_ * auVar80._8_4_;
  auVar89._12_4_ = auVar47._12_4_ * auVar80._12_4_;
  auVar89._16_4_ = auVar80._16_4_ * 0.0;
  auVar89._20_4_ = auVar80._20_4_ * 0.0;
  auVar89._24_4_ = auVar80._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar78 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar37 * -2 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar58));
  auVar83._4_4_ = auVar59._4_4_ * auVar80._4_4_;
  auVar83._0_4_ = auVar59._0_4_ * auVar80._0_4_;
  auVar83._8_4_ = auVar59._8_4_ * auVar80._8_4_;
  auVar83._12_4_ = auVar59._12_4_ * auVar80._12_4_;
  auVar83._16_4_ = auVar80._16_4_ * 0.0;
  auVar83._20_4_ = auVar80._20_4_ * 0.0;
  auVar83._24_4_ = auVar80._24_4_ * 0.0;
  auVar83._28_4_ = auVar80._28_4_;
  auVar80 = vcvtdq2ps_avx(auVar78);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar58));
  auVar87._0_4_ = auVar59._0_4_ * auVar80._0_4_;
  auVar87._4_4_ = auVar59._4_4_ * auVar80._4_4_;
  auVar87._8_4_ = auVar59._8_4_ * auVar80._8_4_;
  auVar87._12_4_ = auVar59._12_4_ * auVar80._12_4_;
  auVar87._16_4_ = auVar80._16_4_ * 0.0;
  auVar87._20_4_ = auVar80._20_4_ * 0.0;
  auVar87._24_4_ = auVar80._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 + uVar37 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar57));
  auVar84._4_4_ = auVar80._4_4_ * auVar3._4_4_;
  auVar84._0_4_ = auVar80._0_4_ * auVar3._0_4_;
  auVar84._8_4_ = auVar80._8_4_ * auVar3._8_4_;
  auVar84._12_4_ = auVar80._12_4_ * auVar3._12_4_;
  auVar84._16_4_ = auVar80._16_4_ * 0.0;
  auVar84._20_4_ = auVar80._20_4_ * 0.0;
  auVar84._24_4_ = auVar80._24_4_ * 0.0;
  auVar84._28_4_ = auVar80._28_4_;
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0x17 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar57));
  auVar75._0_4_ = auVar3._0_4_ * auVar80._0_4_;
  auVar75._4_4_ = auVar3._4_4_ * auVar80._4_4_;
  auVar75._8_4_ = auVar3._8_4_ * auVar80._8_4_;
  auVar75._12_4_ = auVar3._12_4_ * auVar80._12_4_;
  auVar75._16_4_ = auVar80._16_4_ * 0.0;
  auVar75._20_4_ = auVar80._20_4_ * 0.0;
  auVar75._24_4_ = auVar80._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar80 = vpminsd_avx2(auVar82,auVar89);
  auVar78 = vpminsd_avx2(auVar83,auVar87);
  auVar80 = vmaxps_avx(auVar80,auVar78);
  auVar78 = vpminsd_avx2(auVar84,auVar75);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar79._4_4_ = uVar112;
  auVar79._0_4_ = uVar112;
  auVar79._8_4_ = uVar112;
  auVar79._12_4_ = uVar112;
  auVar79._16_4_ = uVar112;
  auVar79._20_4_ = uVar112;
  auVar79._24_4_ = uVar112;
  auVar79._28_4_ = uVar112;
  auVar78 = vmaxps_avx512vl(auVar78,auVar79);
  auVar80 = vmaxps_avx(auVar80,auVar78);
  auVar78._8_4_ = 0x3f7ffffa;
  auVar78._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar78._12_4_ = 0x3f7ffffa;
  auVar78._16_4_ = 0x3f7ffffa;
  auVar78._20_4_ = 0x3f7ffffa;
  auVar78._24_4_ = 0x3f7ffffa;
  auVar78._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar80,auVar78);
  auVar80 = vpmaxsd_avx2(auVar82,auVar89);
  auVar78 = vpmaxsd_avx2(auVar83,auVar87);
  auVar80 = vminps_avx(auVar80,auVar78);
  auVar78 = vpmaxsd_avx2(auVar84,auVar75);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar90._4_4_ = uVar112;
  auVar90._0_4_ = uVar112;
  auVar90._8_4_ = uVar112;
  auVar90._12_4_ = uVar112;
  auVar90._16_4_ = uVar112;
  auVar90._20_4_ = uVar112;
  auVar90._24_4_ = uVar112;
  auVar90._28_4_ = uVar112;
  auVar78 = vminps_avx512vl(auVar78,auVar90);
  auVar80 = vminps_avx(auVar80,auVar78);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar91);
  auVar78 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar78,_DAT_0205a920);
  uVar19 = vcmpps_avx512vl(local_200,auVar80,2);
  bVar45 = (byte)((byte)uVar19 & (byte)uVar21) == 0;
  local_5c1 = !bVar45;
  if (bVar45) {
    return local_5c1;
  }
  uVar44 = (ulong)(byte)((byte)uVar19 & (byte)uVar21);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar257 = ZEXT1664(auVar47);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar251 = ZEXT1664(auVar47);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar253 = ZEXT1664(auVar47);
  auVar47 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar259 = ZEXT1664(auVar47);
LAB_01dd63d9:
  lVar41 = 0;
  for (uVar37 = uVar44; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    lVar41 = lVar41 + 1;
  }
  uVar43 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar43].ptr;
  uVar37 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar41 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar47 = *(undefined1 (*) [16])(_Var11 + uVar37 * (long)pvVar10);
  auVar59 = *(undefined1 (*) [16])(_Var11 + (uVar37 + 1) * (long)pvVar10);
  auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar37 + 2) * (long)pvVar10);
  auVar58 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar37 + 3));
  lVar41 = *(long *)&pGVar8[1].time_range.upper;
  auVar57 = *(undefined1 (*) [16])(lVar41 + (long)p_Var9 * uVar37);
  auVar56 = *(undefined1 (*) [16])(lVar41 + (long)p_Var9 * (uVar37 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar41 + (long)p_Var9 * (uVar37 + 2));
  uVar44 = uVar44 - 1 & uVar44;
  auVar55 = *(undefined1 (*) [16])(lVar41 + (long)p_Var9 * (uVar37 + 3));
  if (uVar44 != 0) {
    uVar42 = uVar44 - 1 & uVar44;
    for (uVar37 = uVar44; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    }
    if (uVar42 != 0) {
      for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar114 = auVar257._0_16_;
  auVar48 = vmulps_avx512vl(auVar55,auVar114);
  auVar50 = vfmadd213ps_fma((undefined1  [16])0x0,auVar4,auVar48);
  auVar49._0_4_ = auVar56._0_4_ + auVar50._0_4_;
  auVar49._4_4_ = auVar56._4_4_ + auVar50._4_4_;
  auVar49._8_4_ = auVar56._8_4_ + auVar50._8_4_;
  auVar49._12_4_ = auVar56._12_4_ + auVar50._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar57,auVar114);
  auVar60 = ZEXT816(0) << 0x40;
  auVar52._0_4_ = auVar55._0_4_ * 0.0;
  auVar52._4_4_ = auVar55._4_4_ * 0.0;
  auVar52._8_4_ = auVar55._8_4_ * 0.0;
  auVar52._12_4_ = auVar55._12_4_ * 0.0;
  auVar113 = auVar251._0_16_;
  auVar50 = vfmadd231ps_avx512vl(auVar52,auVar4,auVar113);
  auVar50 = vfmadd231ps_fma(auVar50,auVar56,auVar60);
  auVar51 = vfnmadd231ps_avx512vl(auVar50,auVar57,auVar113);
  auVar52 = vmulps_avx512vl(auVar58,auVar114);
  auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar3,auVar52);
  auVar238._0_4_ = auVar50._0_4_ + auVar59._0_4_;
  auVar238._4_4_ = auVar50._4_4_ + auVar59._4_4_;
  auVar238._8_4_ = auVar50._8_4_ + auVar59._8_4_;
  auVar238._12_4_ = auVar50._12_4_ + auVar59._12_4_;
  auVar53 = vfmadd231ps_avx512vl(auVar238,auVar47,auVar114);
  auVar243._0_4_ = auVar58._0_4_ * 0.0;
  auVar243._4_4_ = auVar58._4_4_ * 0.0;
  auVar243._8_4_ = auVar58._8_4_ * 0.0;
  auVar243._12_4_ = auVar58._12_4_ * 0.0;
  auVar50 = vfmadd231ps_avx512vl(auVar243,auVar3,auVar113);
  auVar50 = vfmadd231ps_fma(auVar50,auVar59,auVar60);
  auVar54 = vfnmadd231ps_avx512vl(auVar50,auVar47,auVar113);
  auVar64._0_4_ = auVar4._0_4_ + auVar48._0_4_;
  auVar64._4_4_ = auVar4._4_4_ + auVar48._4_4_;
  auVar64._8_4_ = auVar4._8_4_ + auVar48._8_4_;
  auVar64._12_4_ = auVar4._12_4_ + auVar48._12_4_;
  auVar50 = vfmadd231ps_fma(auVar64,auVar56,auVar60);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar57,auVar114);
  auVar55 = vmulps_avx512vl(auVar55,auVar113);
  auVar4 = vfmadd231ps_fma(auVar55,auVar60,auVar4);
  auVar56 = vfnmadd231ps_avx512vl(auVar4,auVar113,auVar56);
  auVar4 = vfmadd231ps_fma(auVar56,auVar60,auVar57);
  auVar190._0_4_ = auVar52._0_4_ + auVar3._0_4_;
  auVar190._4_4_ = auVar52._4_4_ + auVar3._4_4_;
  auVar190._8_4_ = auVar52._8_4_ + auVar3._8_4_;
  auVar190._12_4_ = auVar52._12_4_ + auVar3._12_4_;
  auVar57 = vfmadd231ps_fma(auVar190,auVar59,auVar60);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar47,auVar114);
  auVar58 = vmulps_avx512vl(auVar58,auVar113);
  auVar3 = vfmadd231ps_fma(auVar58,auVar60,auVar3);
  auVar59 = vfnmadd231ps_avx512vl(auVar3,auVar113,auVar59);
  auVar56 = vfmadd231ps_fma(auVar59,auVar60,auVar47);
  auVar47 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar59 = vshufps_avx(auVar53,auVar53,0xc9);
  fVar211 = auVar51._0_4_;
  auVar69._0_4_ = fVar211 * auVar59._0_4_;
  fVar212 = auVar51._4_4_;
  auVar69._4_4_ = fVar212 * auVar59._4_4_;
  fVar110 = auVar51._8_4_;
  auVar69._8_4_ = fVar110 * auVar59._8_4_;
  fVar111 = auVar51._12_4_;
  auVar69._12_4_ = fVar111 * auVar59._12_4_;
  auVar59 = vfmsub231ps_fma(auVar69,auVar47,auVar53);
  auVar3 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar66._0_4_ = fVar211 * auVar59._0_4_;
  auVar66._4_4_ = fVar212 * auVar59._4_4_;
  auVar66._8_4_ = fVar110 * auVar59._8_4_;
  auVar66._12_4_ = fVar111 * auVar59._12_4_;
  auVar47 = vfmsub231ps_fma(auVar66,auVar47,auVar54);
  auVar58 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar59 = vshufps_avx(auVar57,auVar57,0xc9);
  fVar131 = auVar4._0_4_;
  auVar70._0_4_ = fVar131 * auVar59._0_4_;
  fVar148 = auVar4._4_4_;
  auVar70._4_4_ = fVar148 * auVar59._4_4_;
  fVar213 = auVar4._8_4_;
  auVar70._8_4_ = fVar213 * auVar59._8_4_;
  fVar214 = auVar4._12_4_;
  auVar70._12_4_ = fVar214 * auVar59._12_4_;
  auVar59 = vfmsub231ps_fma(auVar70,auVar47,auVar57);
  auVar57 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar59 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar191._0_4_ = auVar59._0_4_ * fVar131;
  auVar191._4_4_ = auVar59._4_4_ * fVar148;
  auVar191._8_4_ = auVar59._8_4_ * fVar213;
  auVar191._12_4_ = auVar59._12_4_ * fVar214;
  auVar47 = vfmsub231ps_fma(auVar191,auVar47,auVar56);
  auVar56 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar108 = auVar47._0_4_;
  auVar192._4_12_ = ZEXT812(0) << 0x20;
  auVar192._0_4_ = fVar108;
  auVar59 = vrsqrt14ss_avx512f(auVar60,auVar192);
  auVar55 = vmulss_avx512f(auVar59,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar47,ZEXT416(0xbf000000));
  fVar216 = auVar59._0_4_;
  fVar216 = auVar55._0_4_ + auVar48._0_4_ * fVar216 * fVar216 * fVar216;
  fVar228 = fVar216 * auVar3._0_4_;
  fVar235 = fVar216 * auVar3._4_4_;
  fVar236 = fVar216 * auVar3._8_4_;
  fVar237 = fVar216 * auVar3._12_4_;
  auVar59 = vdpps_avx(auVar3,auVar58,0x7f);
  auVar201._0_4_ = auVar58._0_4_ * fVar108;
  auVar201._4_4_ = auVar58._4_4_ * fVar108;
  auVar201._8_4_ = auVar58._8_4_ * fVar108;
  auVar201._12_4_ = auVar58._12_4_ * fVar108;
  fVar108 = auVar59._0_4_;
  auVar72._0_4_ = fVar108 * auVar3._0_4_;
  auVar72._4_4_ = fVar108 * auVar3._4_4_;
  auVar72._8_4_ = fVar108 * auVar3._8_4_;
  auVar72._12_4_ = fVar108 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar201,auVar72);
  auVar59 = vrcp14ss_avx512f(auVar60,auVar192);
  auVar47 = vfnmadd213ss_avx512f(auVar47,auVar59,ZEXT416(0x40000000));
  fVar215 = auVar59._0_4_ * auVar47._0_4_;
  auVar47 = vdpps_avx(auVar57,auVar57,0x7f);
  fVar200 = auVar47._0_4_;
  auVar180._4_12_ = ZEXT812(0) << 0x20;
  auVar180._0_4_ = fVar200;
  auVar59 = vrsqrt14ss_avx512f(auVar60,auVar180);
  auVar58 = vmulss_avx512f(auVar59,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar47,ZEXT416(0xbf000000));
  fVar108 = auVar59._0_4_;
  fVar108 = auVar58._0_4_ + auVar55._0_4_ * fVar108 * fVar108 * fVar108;
  fVar217 = fVar108 * auVar57._0_4_;
  fVar225 = fVar108 * auVar57._4_4_;
  fVar226 = fVar108 * auVar57._8_4_;
  fVar227 = fVar108 * auVar57._12_4_;
  auVar59 = vdpps_avx(auVar57,auVar56,0x7f);
  auVar67._0_4_ = fVar200 * auVar56._0_4_;
  auVar67._4_4_ = fVar200 * auVar56._4_4_;
  auVar67._8_4_ = fVar200 * auVar56._8_4_;
  auVar67._12_4_ = fVar200 * auVar56._12_4_;
  fVar200 = auVar59._0_4_;
  auVar71._0_4_ = fVar200 * auVar57._0_4_;
  auVar71._4_4_ = fVar200 * auVar57._4_4_;
  auVar71._8_4_ = fVar200 * auVar57._8_4_;
  auVar71._12_4_ = fVar200 * auVar57._12_4_;
  auVar58 = vsubps_avx(auVar67,auVar71);
  auVar59 = vrcp14ss_avx512f(auVar60,auVar180);
  auVar47 = vfnmadd213ss_avx512f(auVar47,auVar59,ZEXT416(0x40000000));
  fVar200 = auVar47._0_4_ * auVar59._0_4_;
  auVar47 = vshufps_avx(auVar49,auVar49,0xff);
  auVar181._0_4_ = fVar228 * auVar47._0_4_;
  auVar181._4_4_ = fVar235 * auVar47._4_4_;
  auVar181._8_4_ = fVar236 * auVar47._8_4_;
  auVar181._12_4_ = fVar237 * auVar47._12_4_;
  local_320 = vsubps_avx(auVar49,auVar181);
  auVar59 = vshufps_avx(auVar51,auVar51,0xff);
  auVar68._0_4_ = auVar59._0_4_ * fVar228 + auVar47._0_4_ * fVar216 * fVar215 * auVar3._0_4_;
  auVar68._4_4_ = auVar59._4_4_ * fVar235 + auVar47._4_4_ * fVar216 * fVar215 * auVar3._4_4_;
  auVar68._8_4_ = auVar59._8_4_ * fVar236 + auVar47._8_4_ * fVar216 * fVar215 * auVar3._8_4_;
  auVar68._12_4_ = auVar59._12_4_ * fVar237 + auVar47._12_4_ * fVar216 * fVar215 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar51,auVar68);
  local_330._0_4_ = auVar181._0_4_ + auVar49._0_4_;
  local_330._4_4_ = auVar181._4_4_ + auVar49._4_4_;
  fStack_328 = auVar181._8_4_ + auVar49._8_4_;
  fStack_324 = auVar181._12_4_ + auVar49._12_4_;
  auVar47 = vshufps_avx(auVar50,auVar50,0xff);
  auVar155._0_4_ = fVar217 * auVar47._0_4_;
  auVar155._4_4_ = fVar225 * auVar47._4_4_;
  auVar155._8_4_ = fVar226 * auVar47._8_4_;
  auVar155._12_4_ = fVar227 * auVar47._12_4_;
  local_340 = vsubps_avx(auVar50,auVar155);
  auVar59 = vshufps_avx(auVar4,auVar4,0xff);
  auVar53._0_4_ = auVar59._0_4_ * fVar217 + auVar47._0_4_ * fVar108 * auVar58._0_4_ * fVar200;
  auVar53._4_4_ = auVar59._4_4_ * fVar225 + auVar47._4_4_ * fVar108 * auVar58._4_4_ * fVar200;
  auVar53._8_4_ = auVar59._8_4_ * fVar226 + auVar47._8_4_ * fVar108 * auVar58._8_4_ * fVar200;
  auVar53._12_4_ = auVar59._12_4_ * fVar227 + auVar47._12_4_ * fVar108 * auVar58._12_4_ * fVar200;
  auVar47 = vsubps_avx(auVar4,auVar53);
  _local_350 = vaddps_avx512vl(auVar50,auVar155);
  auVar65._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar65._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar65._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar65._12_4_ = auVar3._12_4_ * 0.33333334;
  local_360 = vaddps_avx512vl(local_320,auVar65);
  auVar73._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar73._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar73._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar73._12_4_ = auVar47._12_4_ * 0.33333334;
  local_370 = vsubps_avx512vl(local_340,auVar73);
  auVar50._0_4_ = (fVar211 + auVar68._0_4_) * 0.33333334;
  auVar50._4_4_ = (fVar212 + auVar68._4_4_) * 0.33333334;
  auVar50._8_4_ = (fVar110 + auVar68._8_4_) * 0.33333334;
  auVar50._12_4_ = (fVar111 + auVar68._12_4_) * 0.33333334;
  _local_380 = vaddps_avx512vl(_local_330,auVar50);
  auVar48._0_4_ = (fVar131 + auVar53._0_4_) * 0.33333334;
  auVar48._4_4_ = (fVar148 + auVar53._4_4_) * 0.33333334;
  auVar48._8_4_ = (fVar213 + auVar53._8_4_) * 0.33333334;
  auVar48._12_4_ = (fVar214 + auVar53._12_4_) * 0.33333334;
  _local_390 = vsubps_avx512vl(_local_350,auVar48);
  local_2a0 = vsubps_avx(local_320,auVar5);
  uVar112 = local_2a0._0_4_;
  auVar54._4_4_ = uVar112;
  auVar54._0_4_ = uVar112;
  auVar54._8_4_ = uVar112;
  auVar54._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar59 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar216 = pre->ray_space[k].vz.field_0.m128[0];
  fVar108 = pre->ray_space[k].vz.field_0.m128[1];
  fVar215 = pre->ray_space[k].vz.field_0.m128[2];
  fVar200 = pre->ray_space[k].vz.field_0.m128[3];
  auVar51._0_4_ = fVar216 * auVar59._0_4_;
  auVar51._4_4_ = fVar108 * auVar59._4_4_;
  auVar51._8_4_ = fVar215 * auVar59._8_4_;
  auVar51._12_4_ = fVar200 * auVar59._12_4_;
  auVar47 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar2,auVar47);
  auVar50 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar54);
  local_2b0 = vsubps_avx512vl(local_360,auVar5);
  uVar112 = local_2b0._0_4_;
  auVar62._4_4_ = uVar112;
  auVar62._0_4_ = uVar112;
  auVar62._8_4_ = uVar112;
  auVar62._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar59 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar61._0_4_ = fVar216 * auVar59._0_4_;
  auVar61._4_4_ = fVar108 * auVar59._4_4_;
  auVar61._8_4_ = fVar215 * auVar59._8_4_;
  auVar61._12_4_ = fVar200 * auVar59._12_4_;
  auVar47 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar2,auVar47);
  auVar48 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar62);
  local_2c0 = vsubps_avx512vl(local_370,auVar5);
  uVar112 = local_2c0._0_4_;
  auVar162._4_4_ = uVar112;
  auVar162._0_4_ = uVar112;
  auVar162._8_4_ = uVar112;
  auVar162._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar59 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar63._0_4_ = fVar216 * auVar59._0_4_;
  auVar63._4_4_ = fVar108 * auVar59._4_4_;
  auVar63._8_4_ = fVar215 * auVar59._8_4_;
  auVar63._12_4_ = fVar200 * auVar59._12_4_;
  auVar47 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar47);
  auVar49 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar162);
  local_2d0 = vsubps_avx(local_340,auVar5);
  uVar112 = local_2d0._0_4_;
  auVar163._4_4_ = uVar112;
  auVar163._0_4_ = uVar112;
  auVar163._8_4_ = uVar112;
  auVar163._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar59 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar193._0_4_ = auVar59._0_4_ * fVar216;
  auVar193._4_4_ = auVar59._4_4_ * fVar108;
  auVar193._8_4_ = auVar59._8_4_ * fVar215;
  auVar193._12_4_ = auVar59._12_4_ * fVar200;
  auVar47 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar2,auVar47);
  auVar51 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar163);
  local_2e0 = vsubps_avx(_local_330,auVar5);
  uVar112 = local_2e0._0_4_;
  auVar164._4_4_ = uVar112;
  auVar164._0_4_ = uVar112;
  auVar164._8_4_ = uVar112;
  auVar164._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar59 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar202._0_4_ = auVar59._0_4_ * fVar216;
  auVar202._4_4_ = auVar59._4_4_ * fVar108;
  auVar202._8_4_ = auVar59._8_4_ * fVar215;
  auVar202._12_4_ = auVar59._12_4_ * fVar200;
  auVar47 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar2,auVar47);
  auVar52 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar164);
  local_2f0 = vsubps_avx512vl(_local_380,auVar5);
  uVar112 = local_2f0._0_4_;
  auVar165._4_4_ = uVar112;
  auVar165._0_4_ = uVar112;
  auVar165._8_4_ = uVar112;
  auVar165._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar59 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar218._0_4_ = auVar59._0_4_ * fVar216;
  auVar218._4_4_ = auVar59._4_4_ * fVar108;
  auVar218._8_4_ = auVar59._8_4_ * fVar215;
  auVar218._12_4_ = auVar59._12_4_ * fVar200;
  auVar47 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar47);
  auVar53 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar165);
  local_300 = vsubps_avx512vl(_local_390,auVar5);
  uVar112 = local_300._0_4_;
  auVar166._4_4_ = uVar112;
  auVar166._0_4_ = uVar112;
  auVar166._8_4_ = uVar112;
  auVar166._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_300,local_300,0x55);
  auVar59 = vshufps_avx(local_300,local_300,0xaa);
  auVar229._0_4_ = auVar59._0_4_ * fVar216;
  auVar229._4_4_ = auVar59._4_4_ * fVar108;
  auVar229._8_4_ = auVar59._8_4_ * fVar215;
  auVar229._12_4_ = auVar59._12_4_ * fVar200;
  auVar47 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar2,auVar47);
  auVar54 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar166);
  local_310 = vsubps_avx512vl(_local_350,auVar5);
  uVar112 = local_310._0_4_;
  auVar60._4_4_ = uVar112;
  auVar60._0_4_ = uVar112;
  auVar60._8_4_ = uVar112;
  auVar60._12_4_ = uVar112;
  auVar47 = vshufps_avx(local_310,local_310,0x55);
  auVar59 = vshufps_avx(local_310,local_310,0xaa);
  auVar156._0_4_ = auVar59._0_4_ * fVar216;
  auVar156._4_4_ = auVar59._4_4_ * fVar108;
  auVar156._8_4_ = auVar59._8_4_ * fVar215;
  auVar156._12_4_ = auVar59._12_4_ * fVar200;
  auVar47 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar2,auVar47);
  auVar5 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar1,auVar60);
  auVar3 = vmovlhps_avx(auVar50,auVar52);
  auVar56 = vmovlhps_avx512f(auVar48,auVar53);
  auVar4 = vmovlhps_avx512f(auVar49,auVar54);
  auVar55 = vmovlhps_avx512f(auVar51,auVar5);
  auVar47 = vminps_avx512vl(auVar3,auVar56);
  auVar58 = vmaxps_avx512vl(auVar3,auVar56);
  auVar59 = vminps_avx512vl(auVar4,auVar55);
  auVar59 = vminps_avx(auVar47,auVar59);
  auVar47 = vmaxps_avx512vl(auVar4,auVar55);
  auVar47 = vmaxps_avx(auVar58,auVar47);
  auVar58 = vshufpd_avx(auVar59,auVar59,3);
  auVar57 = vshufpd_avx(auVar47,auVar47,3);
  auVar59 = vminps_avx(auVar59,auVar58);
  auVar47 = vmaxps_avx(auVar47,auVar57);
  auVar59 = vandps_avx512vl(auVar59,auVar253._0_16_);
  auVar47 = vandps_avx512vl(auVar47,auVar253._0_16_);
  auVar47 = vmaxps_avx(auVar59,auVar47);
  auVar59 = vmovshdup_avx(auVar47);
  auVar47 = vmaxss_avx(auVar59,auVar47);
  fVar108 = auVar47._0_4_ * 9.536743e-07;
  auVar167._8_8_ = auVar50._0_8_;
  auVar167._0_8_ = auVar50._0_8_;
  auVar59 = vmovddup_avx512vl(auVar48);
  auVar58 = vmovddup_avx512vl(auVar49);
  auVar113._8_8_ = auVar51._0_8_;
  auVar113._0_8_ = auVar51._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar108));
  auVar47 = vxorps_avx512vl(local_1c0._0_16_,auVar114);
  local_1e0 = vbroadcastss_avx512vl(auVar47);
  local_220 = vpbroadcastd_avx512vl();
  bVar45 = false;
  uVar37 = 0;
  fVar216 = *(float *)(ray + k * 4 + 0x60);
  auVar57 = vsubps_avx512vl(auVar56,auVar3);
  auVar50 = vsubps_avx512vl(auVar4,auVar56);
  local_290 = vsubps_avx512vl(auVar55,auVar4);
  local_3a0 = vsubps_avx(_local_330,local_320);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  local_3c0 = vsubps_avx512vl(_local_390,local_370);
  _local_3d0 = vsubps_avx512vl(_local_350,local_340);
  local_240 = vpbroadcastd_avx512vl();
  auVar47 = ZEXT816(0x3f80000000000000);
  auVar250 = ZEXT1664(auVar47);
  do {
    auVar73 = auVar250._0_16_;
    auVar48 = vshufps_avx(auVar73,auVar73,0x50);
    auVar239._8_4_ = 0x3f800000;
    auVar239._0_8_ = &DAT_3f8000003f800000;
    auVar239._12_4_ = 0x3f800000;
    auVar242._16_4_ = 0x3f800000;
    auVar242._0_16_ = auVar239;
    auVar242._20_4_ = 0x3f800000;
    auVar242._24_4_ = 0x3f800000;
    auVar242._28_4_ = 0x3f800000;
    auVar49 = vsubps_avx(auVar239,auVar48);
    fVar215 = auVar48._0_4_;
    fVar227 = auVar52._0_4_;
    auVar132._0_4_ = fVar227 * fVar215;
    fVar200 = auVar48._4_4_;
    fVar228 = auVar52._4_4_;
    auVar132._4_4_ = fVar228 * fVar200;
    fVar211 = auVar48._8_4_;
    auVar132._8_4_ = fVar227 * fVar211;
    fVar212 = auVar48._12_4_;
    auVar132._12_4_ = fVar228 * fVar212;
    fVar110 = auVar53._0_4_;
    auVar141._0_4_ = fVar110 * fVar215;
    fVar111 = auVar53._4_4_;
    auVar141._4_4_ = fVar111 * fVar200;
    auVar141._8_4_ = fVar110 * fVar211;
    auVar141._12_4_ = fVar111 * fVar212;
    fVar131 = auVar54._0_4_;
    auVar149._0_4_ = fVar131 * fVar215;
    fVar148 = auVar54._4_4_;
    auVar149._4_4_ = fVar148 * fVar200;
    auVar149._8_4_ = fVar131 * fVar211;
    auVar149._12_4_ = fVar148 * fVar212;
    fVar225 = auVar5._0_4_;
    auVar114._0_4_ = fVar225 * fVar215;
    fVar226 = auVar5._4_4_;
    auVar114._4_4_ = fVar226 * fVar200;
    auVar114._8_4_ = fVar225 * fVar211;
    auVar114._12_4_ = fVar226 * fVar212;
    auVar51 = vfmadd231ps_fma(auVar132,auVar49,auVar167);
    auVar60 = vfmadd231ps_avx512vl(auVar141,auVar49,auVar59);
    auVar61 = vfmadd231ps_avx512vl(auVar149,auVar49,auVar58);
    auVar49 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar49);
    auVar48 = vmovshdup_avx(auVar47);
    fVar200 = auVar47._0_4_;
    fVar215 = (auVar48._0_4_ - fVar200) * 0.04761905;
    auVar179._4_4_ = fVar200;
    auVar179._0_4_ = fVar200;
    auVar179._8_4_ = fVar200;
    auVar179._12_4_ = fVar200;
    auVar179._16_4_ = fVar200;
    auVar179._20_4_ = fVar200;
    auVar179._24_4_ = fVar200;
    auVar179._28_4_ = fVar200;
    auVar128._0_8_ = auVar48._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar80 = vsubps_avx(auVar128,auVar179);
    uVar112 = auVar51._0_4_;
    auVar129._4_4_ = uVar112;
    auVar129._0_4_ = uVar112;
    auVar129._8_4_ = uVar112;
    auVar129._12_4_ = uVar112;
    auVar129._16_4_ = uVar112;
    auVar129._20_4_ = uVar112;
    auVar129._24_4_ = uVar112;
    auVar129._28_4_ = uVar112;
    auVar197._8_4_ = 1;
    auVar197._0_8_ = 0x100000001;
    auVar197._12_4_ = 1;
    auVar197._16_4_ = 1;
    auVar197._20_4_ = 1;
    auVar197._24_4_ = 1;
    auVar197._28_4_ = 1;
    auVar90 = ZEXT1632(auVar51);
    auVar78 = vpermps_avx2(auVar197,auVar90);
    auVar79 = vbroadcastss_avx512vl(auVar60);
    auVar91 = ZEXT1632(auVar60);
    auVar81 = vpermps_avx512vl(auVar197,auVar91);
    auVar82 = vbroadcastss_avx512vl(auVar61);
    auVar75 = ZEXT1632(auVar61);
    auVar83 = vpermps_avx512vl(auVar197,auVar75);
    auVar84 = vbroadcastss_avx512vl(auVar49);
    auVar87 = ZEXT1632(auVar49);
    auVar85 = vpermps_avx512vl(auVar197,auVar87);
    auVar198._4_4_ = fVar215;
    auVar198._0_4_ = fVar215;
    auVar198._8_4_ = fVar215;
    auVar198._12_4_ = fVar215;
    auVar198._16_4_ = fVar215;
    auVar198._20_4_ = fVar215;
    auVar198._24_4_ = fVar215;
    auVar198._28_4_ = fVar215;
    auVar88 = auVar256._0_32_;
    auVar76 = vpermps_avx512vl(auVar88,auVar90);
    auVar160._8_4_ = 3;
    auVar160._0_8_ = 0x300000003;
    auVar160._12_4_ = 3;
    auVar160._16_4_ = 3;
    auVar160._20_4_ = 3;
    auVar160._24_4_ = 3;
    auVar160._28_4_ = 3;
    auVar77 = vpermps_avx512vl(auVar160,auVar90);
    auVar86 = vpermps_avx512vl(auVar88,auVar91);
    auVar90 = vpermps_avx2(auVar160,auVar91);
    auVar74 = vpermps_avx512vl(auVar88,auVar75);
    auVar91 = vpermps_avx2(auVar160,auVar75);
    auVar75 = vpermps_avx512vl(auVar88,auVar87);
    auVar87 = vpermps_avx512vl(auVar160,auVar87);
    auVar48 = vfmadd132ps_fma(auVar80,auVar179,_DAT_02020f20);
    auVar80 = vsubps_avx(auVar242,ZEXT1632(auVar48));
    auVar88 = vmulps_avx512vl(auVar79,ZEXT1632(auVar48));
    auVar92 = ZEXT1632(auVar48);
    auVar89 = vmulps_avx512vl(auVar81,auVar92);
    auVar49 = vfmadd231ps_fma(auVar88,auVar80,auVar129);
    auVar51 = vfmadd231ps_fma(auVar89,auVar80,auVar78);
    auVar88 = vmulps_avx512vl(auVar82,auVar92);
    auVar89 = vmulps_avx512vl(auVar83,auVar92);
    auVar79 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar79);
    auVar81 = vfmadd231ps_avx512vl(auVar89,auVar80,auVar81);
    auVar88 = vmulps_avx512vl(auVar84,auVar92);
    auVar89 = ZEXT1632(auVar48);
    auVar85 = vmulps_avx512vl(auVar85,auVar89);
    auVar82 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar85,auVar80,auVar83);
    fVar211 = auVar48._0_4_;
    fVar212 = auVar48._4_4_;
    auVar26._4_4_ = fVar212 * auVar79._4_4_;
    auVar26._0_4_ = fVar211 * auVar79._0_4_;
    fVar213 = auVar48._8_4_;
    auVar26._8_4_ = fVar213 * auVar79._8_4_;
    fVar214 = auVar48._12_4_;
    auVar26._12_4_ = fVar214 * auVar79._12_4_;
    auVar26._16_4_ = auVar79._16_4_ * 0.0;
    auVar26._20_4_ = auVar79._20_4_ * 0.0;
    auVar26._24_4_ = auVar79._24_4_ * 0.0;
    auVar26._28_4_ = fVar200;
    auVar27._4_4_ = fVar212 * auVar81._4_4_;
    auVar27._0_4_ = fVar211 * auVar81._0_4_;
    auVar27._8_4_ = fVar213 * auVar81._8_4_;
    auVar27._12_4_ = fVar214 * auVar81._12_4_;
    auVar27._16_4_ = auVar81._16_4_ * 0.0;
    auVar27._20_4_ = auVar81._20_4_ * 0.0;
    auVar27._24_4_ = auVar81._24_4_ * 0.0;
    auVar27._28_4_ = auVar78._28_4_;
    auVar49 = vfmadd231ps_fma(auVar26,auVar80,ZEXT1632(auVar49));
    auVar51 = vfmadd231ps_fma(auVar27,auVar80,ZEXT1632(auVar51));
    auVar120._0_4_ = fVar211 * auVar82._0_4_;
    auVar120._4_4_ = fVar212 * auVar82._4_4_;
    auVar120._8_4_ = fVar213 * auVar82._8_4_;
    auVar120._12_4_ = fVar214 * auVar82._12_4_;
    auVar120._16_4_ = auVar82._16_4_ * 0.0;
    auVar120._20_4_ = auVar82._20_4_ * 0.0;
    auVar120._24_4_ = auVar82._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    auVar28._4_4_ = fVar212 * auVar83._4_4_;
    auVar28._0_4_ = fVar211 * auVar83._0_4_;
    auVar28._8_4_ = fVar213 * auVar83._8_4_;
    auVar28._12_4_ = fVar214 * auVar83._12_4_;
    auVar28._16_4_ = auVar83._16_4_ * 0.0;
    auVar28._20_4_ = auVar83._20_4_ * 0.0;
    auVar28._24_4_ = auVar83._24_4_ * 0.0;
    auVar28._28_4_ = auVar82._28_4_;
    auVar60 = vfmadd231ps_fma(auVar120,auVar80,auVar79);
    auVar61 = vfmadd231ps_fma(auVar28,auVar80,auVar81);
    auVar29._28_4_ = auVar81._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar214 * auVar61._12_4_,
                            CONCAT48(fVar213 * auVar61._8_4_,
                                     CONCAT44(fVar212 * auVar61._4_4_,fVar211 * auVar61._0_4_))));
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar214 * auVar60._12_4_,
                                                 CONCAT48(fVar213 * auVar60._8_4_,
                                                          CONCAT44(fVar212 * auVar60._4_4_,
                                                                   fVar211 * auVar60._0_4_)))),
                              auVar80,ZEXT1632(auVar49));
    auVar65 = vfmadd231ps_fma(auVar29,auVar80,ZEXT1632(auVar51));
    auVar78 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar49));
    auVar79 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar51));
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar78 = vmulps_avx512vl(auVar78,auVar81);
    auVar79 = vmulps_avx512vl(auVar79,auVar81);
    auVar189._0_4_ = fVar215 * auVar78._0_4_;
    auVar189._4_4_ = fVar215 * auVar78._4_4_;
    auVar189._8_4_ = fVar215 * auVar78._8_4_;
    auVar189._12_4_ = fVar215 * auVar78._12_4_;
    auVar189._16_4_ = fVar215 * auVar78._16_4_;
    auVar189._20_4_ = fVar215 * auVar78._20_4_;
    auVar189._24_4_ = fVar215 * auVar78._24_4_;
    auVar189._28_4_ = 0;
    auVar78 = vmulps_avx512vl(auVar198,auVar79);
    auVar60 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_0205fd20,ZEXT1632(auVar60));
    auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_0205fd20,ZEXT1632(auVar60));
    auVar121._0_4_ = auVar189._0_4_ + auVar64._0_4_;
    auVar121._4_4_ = auVar189._4_4_ + auVar64._4_4_;
    auVar121._8_4_ = auVar189._8_4_ + auVar64._8_4_;
    auVar121._12_4_ = auVar189._12_4_ + auVar64._12_4_;
    auVar121._16_4_ = auVar189._16_4_ + 0.0;
    auVar121._20_4_ = auVar189._20_4_ + 0.0;
    auVar121._24_4_ = auVar189._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar92 = ZEXT1632(auVar60);
    auVar83 = vpermt2ps_avx512vl(auVar189,_DAT_0205fd20,auVar92);
    auVar84 = vaddps_avx512vl(ZEXT1632(auVar65),auVar78);
    auVar85 = vpermt2ps_avx512vl(auVar78,_DAT_0205fd20,auVar92);
    auVar78 = vsubps_avx(auVar79,auVar83);
    auVar83 = vsubps_avx512vl(auVar82,auVar85);
    auVar85 = vmulps_avx512vl(auVar86,auVar89);
    auVar88 = vmulps_avx512vl(auVar90,auVar89);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar80,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar77);
    auVar77 = vmulps_avx512vl(auVar74,auVar89);
    auVar88 = vmulps_avx512vl(auVar91,auVar89);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar86);
    auVar90 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar90);
    auVar86 = vmulps_avx512vl(auVar75,auVar89);
    auVar75 = vmulps_avx512vl(auVar87,auVar89);
    auVar49 = vfmadd231ps_fma(auVar86,auVar80,auVar74);
    auVar51 = vfmadd231ps_fma(auVar75,auVar80,auVar91);
    auVar86 = vmulps_avx512vl(auVar89,auVar77);
    auVar75 = vmulps_avx512vl(ZEXT1632(auVar48),auVar90);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar85);
    auVar76 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar76);
    auVar77 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar214 * auVar49._12_4_,
                                            CONCAT48(fVar213 * auVar49._8_4_,
                                                     CONCAT44(fVar212 * auVar49._4_4_,
                                                              fVar211 * auVar49._0_4_)))),auVar80,
                         auVar77);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar214 * auVar51._12_4_,
                                            CONCAT48(fVar213 * auVar51._8_4_,
                                                     CONCAT44(fVar212 * auVar51._4_4_,
                                                              fVar211 * auVar51._0_4_)))),auVar80,
                         auVar90);
    auVar30._4_4_ = fVar212 * auVar77._4_4_;
    auVar30._0_4_ = fVar211 * auVar77._0_4_;
    auVar30._8_4_ = fVar213 * auVar77._8_4_;
    auVar30._12_4_ = fVar214 * auVar77._12_4_;
    auVar30._16_4_ = auVar77._16_4_ * 0.0;
    auVar30._20_4_ = auVar77._20_4_ * 0.0;
    auVar30._24_4_ = auVar77._24_4_ * 0.0;
    auVar30._28_4_ = auVar91._28_4_;
    auVar31._4_4_ = fVar212 * auVar90._4_4_;
    auVar31._0_4_ = fVar211 * auVar90._0_4_;
    auVar31._8_4_ = fVar213 * auVar90._8_4_;
    auVar31._12_4_ = fVar214 * auVar90._12_4_;
    auVar31._16_4_ = auVar90._16_4_ * 0.0;
    auVar31._20_4_ = auVar90._20_4_ * 0.0;
    auVar31._24_4_ = auVar90._24_4_ * 0.0;
    auVar31._28_4_ = auVar74._28_4_;
    auVar91 = vfmadd231ps_avx512vl(auVar30,auVar80,auVar85);
    auVar86 = vfmadd231ps_avx512vl(auVar31,auVar76,auVar80);
    auVar80 = vsubps_avx512vl(auVar77,auVar85);
    auVar90 = vsubps_avx512vl(auVar90,auVar76);
    auVar80 = vmulps_avx512vl(auVar80,auVar81);
    auVar90 = vmulps_avx512vl(auVar90,auVar81);
    fVar200 = fVar215 * auVar80._0_4_;
    fVar211 = fVar215 * auVar80._4_4_;
    auVar32._4_4_ = fVar211;
    auVar32._0_4_ = fVar200;
    fVar212 = fVar215 * auVar80._8_4_;
    auVar32._8_4_ = fVar212;
    fVar213 = fVar215 * auVar80._12_4_;
    auVar32._12_4_ = fVar213;
    fVar214 = fVar215 * auVar80._16_4_;
    auVar32._16_4_ = fVar214;
    fVar217 = fVar215 * auVar80._20_4_;
    auVar32._20_4_ = fVar217;
    fVar215 = fVar215 * auVar80._24_4_;
    auVar32._24_4_ = fVar215;
    auVar32._28_4_ = auVar80._28_4_;
    auVar90 = vmulps_avx512vl(auVar198,auVar90);
    auVar81 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,auVar92);
    auVar85 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,auVar92);
    auVar199._0_4_ = auVar91._0_4_ + fVar200;
    auVar199._4_4_ = auVar91._4_4_ + fVar211;
    auVar199._8_4_ = auVar91._8_4_ + fVar212;
    auVar199._12_4_ = auVar91._12_4_ + fVar213;
    auVar199._16_4_ = auVar91._16_4_ + fVar214;
    auVar199._20_4_ = auVar91._20_4_ + fVar217;
    auVar199._24_4_ = auVar91._24_4_ + fVar215;
    auVar199._28_4_ = auVar91._28_4_ + auVar80._28_4_;
    auVar80 = vpermt2ps_avx512vl(auVar32,_DAT_0205fd20,ZEXT1632(auVar60));
    auVar76 = vaddps_avx512vl(auVar86,auVar90);
    auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_0205fd20,ZEXT1632(auVar60));
    auVar80 = vsubps_avx(auVar81,auVar80);
    auVar90 = vsubps_avx512vl(auVar85,auVar90);
    auVar138 = ZEXT1632(auVar64);
    auVar77 = vsubps_avx512vl(auVar91,auVar138);
    auVar145 = ZEXT1632(auVar65);
    auVar74 = vsubps_avx512vl(auVar86,auVar145);
    auVar75 = vsubps_avx512vl(auVar81,auVar79);
    auVar77 = vaddps_avx512vl(auVar77,auVar75);
    auVar75 = vsubps_avx512vl(auVar85,auVar82);
    auVar74 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vmulps_avx512vl(auVar145,auVar77);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar138,auVar74);
    auVar87 = vmulps_avx512vl(auVar84,auVar77);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar121,auVar74);
    auVar88 = vmulps_avx512vl(auVar83,auVar77);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar78,auVar74);
    auVar89 = vmulps_avx512vl(auVar82,auVar77);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar79,auVar74);
    auVar92 = vmulps_avx512vl(auVar86,auVar77);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar91,auVar74);
    auVar93 = vmulps_avx512vl(auVar76,auVar77);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar199,auVar74);
    auVar94 = vmulps_avx512vl(auVar90,auVar77);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar80,auVar74);
    auVar77 = vmulps_avx512vl(auVar85,auVar77);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar81,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar87);
    auVar75 = vmaxps_avx512vl(auVar75,auVar87);
    auVar87 = vminps_avx512vl(auVar88,auVar89);
    auVar74 = vminps_avx512vl(auVar74,auVar87);
    auVar87 = vmaxps_avx512vl(auVar88,auVar89);
    auVar75 = vmaxps_avx512vl(auVar75,auVar87);
    auVar87 = vminps_avx512vl(auVar92,auVar93);
    auVar88 = vmaxps_avx512vl(auVar92,auVar93);
    auVar89 = vminps_avx512vl(auVar94,auVar77);
    auVar87 = vminps_avx512vl(auVar87,auVar89);
    auVar74 = vminps_avx512vl(auVar74,auVar87);
    auVar77 = vmaxps_avx512vl(auVar94,auVar77);
    auVar77 = vmaxps_avx512vl(auVar88,auVar77);
    auVar77 = vmaxps_avx512vl(auVar75,auVar77);
    uVar19 = vcmpps_avx512vl(auVar74,local_1c0,2);
    uVar21 = vcmpps_avx512vl(auVar77,local_1e0,5);
    uVar39 = 0;
    bVar35 = (byte)uVar19 & (byte)uVar21 & 0x7f;
    if (bVar35 != 0) {
      auVar77 = vsubps_avx512vl(auVar79,auVar138);
      auVar74 = vsubps_avx512vl(auVar82,auVar145);
      auVar75 = vsubps_avx512vl(auVar81,auVar91);
      auVar77 = vaddps_avx512vl(auVar77,auVar75);
      auVar75 = vsubps_avx512vl(auVar85,auVar86);
      auVar74 = vaddps_avx512vl(auVar74,auVar75);
      auVar75 = vmulps_avx512vl(auVar145,auVar77);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar74,auVar138);
      auVar84 = vmulps_avx512vl(auVar84,auVar77);
      auVar84 = vfnmadd213ps_avx512vl(auVar121,auVar74,auVar84);
      auVar83 = vmulps_avx512vl(auVar83,auVar77);
      auVar83 = vfnmadd213ps_avx512vl(auVar78,auVar74,auVar83);
      auVar78 = vmulps_avx512vl(auVar82,auVar77);
      auVar82 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar79);
      auVar78 = vmulps_avx512vl(auVar86,auVar77);
      auVar91 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar91);
      auVar78 = vmulps_avx512vl(auVar76,auVar77);
      auVar76 = vfnmadd213ps_avx512vl(auVar199,auVar74,auVar78);
      auVar78 = vmulps_avx512vl(auVar90,auVar77);
      auVar86 = vfnmadd213ps_avx512vl(auVar80,auVar74,auVar78);
      auVar80 = vmulps_avx512vl(auVar85,auVar77);
      auVar81 = vfnmadd231ps_avx512vl(auVar80,auVar81,auVar74);
      auVar78 = vminps_avx(auVar75,auVar84);
      auVar80 = vmaxps_avx(auVar75,auVar84);
      auVar79 = vminps_avx(auVar83,auVar82);
      auVar79 = vminps_avx(auVar78,auVar79);
      auVar78 = vmaxps_avx(auVar83,auVar82);
      auVar80 = vmaxps_avx(auVar80,auVar78);
      auVar90 = vminps_avx(auVar91,auVar76);
      auVar78 = vmaxps_avx(auVar91,auVar76);
      auVar91 = vminps_avx(auVar86,auVar81);
      auVar90 = vminps_avx(auVar90,auVar91);
      auVar90 = vminps_avx(auVar79,auVar90);
      auVar79 = vmaxps_avx(auVar86,auVar81);
      auVar78 = vmaxps_avx(auVar78,auVar79);
      auVar80 = vmaxps_avx(auVar80,auVar78);
      uVar19 = vcmpps_avx512vl(auVar80,local_1e0,5);
      uVar21 = vcmpps_avx512vl(auVar90,local_1c0,2);
      uVar39 = (uint)(bVar35 & (byte)uVar19 & (byte)uVar21);
    }
    if (uVar39 != 0) {
      auStack_440[uVar37] = uVar39;
      uVar19 = vmovlps_avx(auVar47);
      *(undefined8 *)(&uStack_280 + uVar37 * 2) = uVar19;
      uVar42 = vmovlps_avx512f(auVar73);
      auStack_1a0[uVar37] = uVar42;
      uVar37 = (ulong)((int)uVar37 + 1);
    }
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar251 = ZEXT1664(auVar47);
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar253 = ZEXT1664(auVar47);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar252 = ZEXT3264(auVar80);
    auVar254 = ZEXT464(0x3f800000);
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar255 = ZEXT1664(auVar47);
    do {
      auVar47 = auVar255._0_16_;
      if ((int)uVar37 == 0) {
        if (bVar45) {
          return local_5c1;
        }
        uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar25._4_4_ = uVar112;
        auVar25._0_4_ = uVar112;
        auVar25._8_4_ = uVar112;
        auVar25._12_4_ = uVar112;
        auVar25._16_4_ = uVar112;
        auVar25._20_4_ = uVar112;
        auVar25._24_4_ = uVar112;
        auVar25._28_4_ = uVar112;
        uVar19 = vcmpps_avx512vl(local_200,auVar25,2);
        uVar43 = (uint)uVar44 & (uint)uVar19;
        uVar44 = (ulong)uVar43;
        local_5c1 = uVar43 != 0;
        if (!local_5c1) {
          return local_5c1;
        }
        goto LAB_01dd63d9;
      }
      uVar36 = (int)uVar37 - 1;
      uVar38 = (ulong)uVar36;
      uVar39 = (&uStack_280)[uVar38 * 2];
      fVar215 = afStack_27c[uVar38 * 2];
      uVar7 = auStack_440[uVar38];
      auVar248._8_8_ = 0;
      auVar248._0_8_ = auStack_1a0[uVar38];
      auVar250 = ZEXT1664(auVar248);
      lVar41 = 0;
      for (uVar42 = (ulong)uVar7; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar41 = lVar41 + 1;
      }
      uVar40 = uVar7 - 1 & uVar7;
      auStack_440[uVar38] = uVar40;
      if (uVar40 == 0) {
        uVar37 = (ulong)uVar36;
      }
      auVar122._0_4_ = (float)lVar41;
      auVar122._4_8_ = SUB128(ZEXT812(0),4);
      auVar122._12_4_ = 0;
      auVar49 = vmulss_avx512f(auVar122,SUB6416(ZEXT464(0x3e124925),0));
      lVar41 = lVar41 + 1;
      auVar61 = auVar257._0_16_;
      auVar48 = vcvtsi2ss_avx512f(auVar61,lVar41);
      auVar48 = vmulss_avx512f(auVar48,SUB6416(ZEXT464(0x3e124925),0));
      auVar60 = auVar254._0_16_;
      auVar51 = vsubss_avx512f(auVar60,auVar49);
      auVar49 = vmulss_avx512f(ZEXT416((uint)fVar215),auVar49);
      auVar49 = vfmadd231ss_avx512f(auVar49,ZEXT416(uVar39),auVar51);
      auVar51 = vsubss_avx512f(auVar60,auVar48);
      auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar48._0_4_)),ZEXT416(uVar39),auVar51);
      auVar51 = vsubss_avx512f(auVar48,auVar49);
      vucomiss_avx512f(auVar51);
      if (uVar7 == 0 || lVar41 == 0) break;
      auVar64 = vshufps_avx(auVar248,auVar248,0x50);
      vucomiss_avx512f(auVar51);
      auVar62 = vsubps_avx512vl(auVar47,auVar64);
      fVar215 = auVar64._0_4_;
      auVar133._0_4_ = fVar227 * fVar215;
      fVar200 = auVar64._4_4_;
      auVar133._4_4_ = fVar228 * fVar200;
      fVar211 = auVar64._8_4_;
      auVar133._8_4_ = fVar227 * fVar211;
      fVar212 = auVar64._12_4_;
      auVar133._12_4_ = fVar228 * fVar212;
      auVar142._0_4_ = fVar110 * fVar215;
      auVar142._4_4_ = fVar111 * fVar200;
      auVar142._8_4_ = fVar110 * fVar211;
      auVar142._12_4_ = fVar111 * fVar212;
      auVar150._0_4_ = fVar131 * fVar215;
      auVar150._4_4_ = fVar148 * fVar200;
      auVar150._8_4_ = fVar131 * fVar211;
      auVar150._12_4_ = fVar148 * fVar212;
      auVar115._0_4_ = fVar225 * fVar215;
      auVar115._4_4_ = fVar226 * fVar200;
      auVar115._8_4_ = fVar225 * fVar211;
      auVar115._12_4_ = fVar226 * fVar212;
      auVar64 = vfmadd231ps_fma(auVar133,auVar62,auVar167);
      auVar65 = vfmadd231ps_fma(auVar142,auVar62,auVar59);
      auVar73 = vfmadd231ps_fma(auVar150,auVar62,auVar58);
      auVar63 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar62);
      auVar130._16_16_ = auVar64;
      auVar130._0_16_ = auVar64;
      auVar139._16_16_ = auVar65;
      auVar139._0_16_ = auVar65;
      auVar146._16_16_ = auVar73;
      auVar146._0_16_ = auVar73;
      auVar161._0_4_ = auVar49._0_4_;
      auVar161._4_4_ = auVar161._0_4_;
      auVar161._8_4_ = auVar161._0_4_;
      auVar161._12_4_ = auVar161._0_4_;
      uVar112 = auVar48._0_4_;
      auVar161._20_4_ = uVar112;
      auVar161._16_4_ = uVar112;
      auVar161._24_4_ = uVar112;
      auVar161._28_4_ = uVar112;
      auVar80 = vsubps_avx(auVar139,auVar130);
      auVar65 = vfmadd213ps_fma(auVar80,auVar161,auVar130);
      auVar80 = vsubps_avx(auVar146,auVar139);
      auVar62 = vfmadd213ps_fma(auVar80,auVar161,auVar139);
      auVar64 = vsubps_avx(auVar63,auVar73);
      auVar140._16_16_ = auVar64;
      auVar140._0_16_ = auVar64;
      auVar64 = vfmadd213ps_fma(auVar140,auVar161,auVar146);
      auVar80 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar65));
      auVar65 = vfmadd213ps_fma(auVar80,auVar161,ZEXT1632(auVar65));
      auVar80 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar62));
      auVar64 = vfmadd213ps_fma(auVar80,auVar161,ZEXT1632(auVar62));
      auVar80 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar65));
      auVar72 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar80,auVar161);
      auVar80 = vmulps_avx512vl(auVar80,auVar252._0_32_);
      auVar96._16_16_ = auVar80._16_16_;
      auVar64 = vmulss_avx512f(auVar51,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar215 = auVar64._0_4_;
      auVar151._0_8_ =
           CONCAT44(auVar72._4_4_ + fVar215 * auVar80._4_4_,auVar72._0_4_ + fVar215 * auVar80._0_4_)
      ;
      auVar151._8_4_ = auVar72._8_4_ + fVar215 * auVar80._8_4_;
      auVar151._12_4_ = auVar72._12_4_ + fVar215 * auVar80._12_4_;
      auVar134._0_4_ = fVar215 * auVar80._16_4_;
      auVar134._4_4_ = fVar215 * auVar80._20_4_;
      auVar134._8_4_ = fVar215 * auVar80._24_4_;
      auVar134._12_4_ = fVar215 * auVar80._28_4_;
      auVar155 = vsubps_avx((undefined1  [16])0x0,auVar134);
      auVar71 = vshufpd_avx(auVar72,auVar72,3);
      auVar69 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar64 = vsubps_avx(auVar71,auVar72);
      auVar65 = vsubps_avx(auVar69,(undefined1  [16])0x0);
      auVar168._0_4_ = auVar65._0_4_ + auVar64._0_4_;
      auVar168._4_4_ = auVar65._4_4_ + auVar64._4_4_;
      auVar168._8_4_ = auVar65._8_4_ + auVar64._8_4_;
      auVar168._12_4_ = auVar65._12_4_ + auVar64._12_4_;
      auVar64 = vshufps_avx(auVar72,auVar72,0xb1);
      auVar65 = vshufps_avx(auVar151,auVar151,0xb1);
      auVar73 = vshufps_avx(auVar155,auVar155,0xb1);
      auVar62 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar230._4_4_ = auVar168._0_4_;
      auVar230._0_4_ = auVar168._0_4_;
      auVar230._8_4_ = auVar168._0_4_;
      auVar230._12_4_ = auVar168._0_4_;
      auVar63 = vshufps_avx(auVar168,auVar168,0x55);
      fVar215 = auVar63._0_4_;
      auVar182._0_4_ = auVar64._0_4_ * fVar215;
      fVar200 = auVar63._4_4_;
      auVar182._4_4_ = auVar64._4_4_ * fVar200;
      fVar211 = auVar63._8_4_;
      auVar182._8_4_ = auVar64._8_4_ * fVar211;
      fVar212 = auVar63._12_4_;
      auVar182._12_4_ = auVar64._12_4_ * fVar212;
      auVar194._0_4_ = auVar65._0_4_ * fVar215;
      auVar194._4_4_ = auVar65._4_4_ * fVar200;
      auVar194._8_4_ = auVar65._8_4_ * fVar211;
      auVar194._12_4_ = auVar65._12_4_ * fVar212;
      auVar203._0_4_ = auVar73._0_4_ * fVar215;
      auVar203._4_4_ = auVar73._4_4_ * fVar200;
      auVar203._8_4_ = auVar73._8_4_ * fVar211;
      auVar203._12_4_ = auVar73._12_4_ * fVar212;
      auVar169._0_4_ = auVar62._0_4_ * fVar215;
      auVar169._4_4_ = auVar62._4_4_ * fVar200;
      auVar169._8_4_ = auVar62._8_4_ * fVar211;
      auVar169._12_4_ = auVar62._12_4_ * fVar212;
      auVar64 = vfmadd231ps_fma(auVar182,auVar230,auVar72);
      auVar65 = vfmadd231ps_fma(auVar194,auVar230,auVar151);
      auVar63 = vfmadd231ps_fma(auVar203,auVar230,auVar155);
      auVar156 = vfmadd231ps_fma(auVar169,(undefined1  [16])0x0,auVar230);
      auVar70 = vshufpd_avx(auVar64,auVar64,1);
      auVar66 = vshufpd_avx(auVar65,auVar65,1);
      auVar67 = vshufpd_avx(auVar63,auVar63,1);
      auVar68 = vshufpd_avx(auVar156,auVar156,1);
      auVar73 = vminss_avx(auVar64,auVar65);
      auVar64 = vmaxss_avx(auVar65,auVar64);
      auVar62 = vminss_avx(auVar63,auVar156);
      auVar65 = vmaxss_avx(auVar156,auVar63);
      auVar62 = vminss_avx(auVar73,auVar62);
      auVar64 = vmaxss_avx(auVar65,auVar64);
      auVar63 = vminss_avx(auVar70,auVar66);
      auVar65 = vmaxss_avx(auVar66,auVar70);
      auVar70 = vminss_avx(auVar67,auVar68);
      auVar73 = vmaxss_avx(auVar68,auVar67);
      auVar63 = vminss_avx(auVar63,auVar70);
      auVar65 = vmaxss_avx(auVar73,auVar65);
      fVar211 = auVar62._0_4_;
      fVar200 = auVar65._0_4_;
      fVar215 = auVar64._0_4_;
      if ((0.0001 <= fVar211) || (fVar200 <= -0.0001)) {
        uVar19 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar21 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar215 & ((byte)uVar21 | (byte)uVar19)) != 0) goto LAB_01dd7315;
        uVar19 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar65,5);
        uVar21 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar21 | (ushort)uVar19) & 1) == 0) goto LAB_01dd7315;
        bVar20 = true;
        auVar250 = ZEXT1664(auVar248);
      }
      else {
LAB_01dd7315:
        auVar66 = auVar259._0_16_;
        uVar19 = vcmpss_avx512f(auVar62,auVar66,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        iVar107 = auVar254._0_4_;
        fVar212 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar107);
        uVar19 = vcmpss_avx512f(auVar64,auVar66,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        fVar213 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar107);
        bVar20 = fVar212 != fVar213;
        iVar258 = auVar259._0_4_;
        auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar20 * iVar258 + (uint)!bVar20 * 0x7f800000;
        auVar70 = auVar95._0_16_;
        auVar98._16_16_ = auVar96._16_16_;
        auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar20 * iVar258 + (uint)!bVar20 * -0x800000;
        auVar73 = auVar97._0_16_;
        uVar19 = vcmpss_avx512f(auVar63,auVar66,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        fVar214 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar107);
        if ((fVar212 != fVar214) || (NAN(fVar212) || NAN(fVar214))) {
          fVar212 = auVar63._0_4_;
          bVar20 = fVar212 == fVar211;
          if ((!bVar20) || (NAN(fVar212) || NAN(fVar211))) {
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(auVar62,auVar24);
            auVar244._0_4_ = auVar62._0_4_ / (fVar212 - fVar211);
            auVar244._4_12_ = auVar62._4_12_;
            auVar62 = vsubss_avx512f(auVar60,auVar244);
            auVar63 = vfmadd213ss_avx512f(auVar62,auVar66,auVar244);
            auVar62 = auVar63;
          }
          else {
            vucomiss_avx512f(auVar66);
            auVar100._16_16_ = auVar96._16_16_;
            auVar100._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar20 * iVar258 + (uint)!bVar20 * 0x7f800000;
            auVar63 = auVar99._0_16_;
            auVar62 = ZEXT416((uint)bVar20 * 0x3f800000 + (uint)!bVar20 * -0x800000);
          }
          auVar70 = vminss_avx(auVar70,auVar63);
          auVar73 = vmaxss_avx(auVar62,auVar73);
        }
        auVar250 = ZEXT1664(auVar248);
        uVar19 = vcmpss_avx512f(auVar65,auVar66,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        fVar211 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar107);
        if ((fVar213 != fVar211) || (NAN(fVar213) || NAN(fVar211))) {
          bVar20 = fVar200 == fVar215;
          if ((!bVar20) || (NAN(fVar200) || NAN(fVar215))) {
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar64 = vxorps_avx512vl(auVar64,auVar23);
            auVar204._0_4_ = auVar64._0_4_ / (fVar200 - fVar215);
            auVar204._4_12_ = auVar64._4_12_;
            auVar64 = vsubss_avx512f(auVar60,auVar204);
            auVar65 = vfmadd213ss_avx512f(auVar64,auVar66,auVar204);
            auVar64 = auVar65;
          }
          else {
            vucomiss_avx512f(auVar66);
            auVar102._16_16_ = auVar96._16_16_;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar20 * iVar258 + (uint)!bVar20 * 0x7f800000;
            auVar65 = auVar101._0_16_;
            auVar64 = ZEXT416((uint)bVar20 * 0x3f800000 + (uint)!bVar20 * -0x800000);
          }
          auVar70 = vminss_avx(auVar70,auVar65);
          auVar73 = vmaxss_avx(auVar64,auVar73);
        }
        bVar20 = fVar214 != fVar211;
        auVar64 = vminss_avx512f(auVar70,auVar60);
        auVar104._16_16_ = auVar96._16_16_;
        auVar104._0_16_ = auVar70;
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (uint)bVar20 * auVar64._0_4_ + (uint)!bVar20 * auVar70._0_4_;
        auVar64 = vmaxss_avx512f(auVar60,auVar73);
        auVar106._16_16_ = auVar96._16_16_;
        auVar106._0_16_ = auVar73;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar20 * auVar64._0_4_ + (uint)!bVar20 * auVar73._0_4_;
        auVar64 = vmaxss_avx512f(auVar66,auVar103._0_16_);
        auVar65 = vminss_avx512f(auVar105._0_16_,auVar60);
        bVar20 = true;
        if (auVar64._0_4_ <= auVar65._0_4_) {
          auVar66 = vmaxss_avx512f(auVar66,ZEXT416((uint)(auVar64._0_4_ + -0.1)));
          auVar67 = vminss_avx512f(ZEXT416((uint)(auVar65._0_4_ + 0.1)),auVar60);
          auVar116._0_8_ = auVar72._0_8_;
          auVar116._8_8_ = auVar116._0_8_;
          auVar195._8_8_ = auVar151._0_8_;
          auVar195._0_8_ = auVar151._0_8_;
          auVar205._8_8_ = auVar155._0_8_;
          auVar205._0_8_ = auVar155._0_8_;
          auVar64 = vshufpd_avx(auVar151,auVar151,3);
          auVar65 = vshufpd_avx(auVar155,auVar155,3);
          auVar73 = vshufps_avx(auVar66,auVar67,0);
          auVar68 = vsubps_avx512vl(auVar47,auVar73);
          fVar215 = auVar73._0_4_;
          auVar240._0_4_ = fVar215 * auVar71._0_4_;
          fVar200 = auVar73._4_4_;
          auVar240._4_4_ = fVar200 * auVar71._4_4_;
          fVar211 = auVar73._8_4_;
          auVar240._8_4_ = fVar211 * auVar71._8_4_;
          fVar212 = auVar73._12_4_;
          auVar240._12_4_ = fVar212 * auVar71._12_4_;
          auVar152._0_4_ = fVar215 * auVar64._0_4_;
          auVar152._4_4_ = fVar200 * auVar64._4_4_;
          auVar152._8_4_ = fVar211 * auVar64._8_4_;
          auVar152._12_4_ = fVar212 * auVar64._12_4_;
          auVar157._0_4_ = fVar215 * auVar65._0_4_;
          auVar157._4_4_ = fVar200 * auVar65._4_4_;
          auVar157._8_4_ = fVar211 * auVar65._8_4_;
          auVar157._12_4_ = fVar212 * auVar65._12_4_;
          auVar135._0_4_ = fVar215 * auVar69._0_4_;
          auVar135._4_4_ = fVar200 * auVar69._4_4_;
          auVar135._8_4_ = fVar211 * auVar69._8_4_;
          auVar135._12_4_ = fVar212 * auVar69._12_4_;
          auVar62 = vfmadd231ps_fma(auVar240,auVar68,auVar116);
          auVar63 = vfmadd231ps_fma(auVar152,auVar68,auVar195);
          auVar70 = vfmadd231ps_fma(auVar157,auVar68,auVar205);
          auVar71 = vfmadd231ps_fma(auVar135,auVar68,ZEXT816(0));
          auVar65 = vsubss_avx512f(auVar60,auVar66);
          auVar64 = vmovshdup_avx(auVar248);
          auVar155 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar66._0_4_)),auVar248,auVar65
                                    );
          auVar65 = vsubss_avx512f(auVar60,auVar67);
          auVar156 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar64._0_4_)),auVar248,auVar65
                                    );
          auVar69 = vdivss_avx512f(auVar60,auVar51);
          auVar51 = vsubps_avx(auVar63,auVar62);
          auVar123._0_4_ = auVar51._0_4_ * 3.0;
          auVar123._4_4_ = auVar51._4_4_ * 3.0;
          auVar123._8_4_ = auVar51._8_4_ * 3.0;
          auVar123._12_4_ = auVar51._12_4_ * 3.0;
          auVar51 = vsubps_avx(auVar70,auVar63);
          auVar170._0_4_ = auVar51._0_4_ * 3.0;
          auVar170._4_4_ = auVar51._4_4_ * 3.0;
          auVar170._8_4_ = auVar51._8_4_ * 3.0;
          auVar170._12_4_ = auVar51._12_4_ * 3.0;
          auVar51 = vsubps_avx(auVar71,auVar70);
          auVar183._0_4_ = auVar51._0_4_ * 3.0;
          auVar183._4_4_ = auVar51._4_4_ * 3.0;
          auVar183._8_4_ = auVar51._8_4_ * 3.0;
          auVar183._12_4_ = auVar51._12_4_ * 3.0;
          auVar64 = vminps_avx(auVar170,auVar183);
          auVar51 = vmaxps_avx(auVar170,auVar183);
          auVar64 = vminps_avx(auVar123,auVar64);
          auVar51 = vmaxps_avx(auVar123,auVar51);
          auVar65 = vshufpd_avx(auVar64,auVar64,3);
          auVar73 = vshufpd_avx(auVar51,auVar51,3);
          auVar64 = vminps_avx(auVar64,auVar65);
          auVar51 = vmaxps_avx(auVar51,auVar73);
          fVar215 = auVar69._0_4_;
          auVar184._0_4_ = fVar215 * auVar64._0_4_;
          auVar184._4_4_ = fVar215 * auVar64._4_4_;
          auVar184._8_4_ = fVar215 * auVar64._8_4_;
          auVar184._12_4_ = fVar215 * auVar64._12_4_;
          auVar171._0_4_ = fVar215 * auVar51._0_4_;
          auVar171._4_4_ = fVar215 * auVar51._4_4_;
          auVar171._8_4_ = fVar215 * auVar51._8_4_;
          auVar171._12_4_ = fVar215 * auVar51._12_4_;
          auVar69 = vdivss_avx512f(auVar60,ZEXT416((uint)(auVar156._0_4_ - auVar155._0_4_)));
          auVar51 = vshufpd_avx(auVar62,auVar62,3);
          auVar64 = vshufpd_avx(auVar63,auVar63,3);
          auVar65 = vshufpd_avx(auVar70,auVar70,3);
          auVar73 = vshufpd_avx(auVar71,auVar71,3);
          auVar51 = vsubps_avx(auVar51,auVar62);
          auVar62 = vsubps_avx(auVar64,auVar63);
          auVar63 = vsubps_avx(auVar65,auVar70);
          auVar73 = vsubps_avx(auVar73,auVar71);
          auVar64 = vminps_avx(auVar51,auVar62);
          auVar51 = vmaxps_avx(auVar51,auVar62);
          auVar65 = vminps_avx(auVar63,auVar73);
          auVar65 = vminps_avx(auVar64,auVar65);
          auVar64 = vmaxps_avx(auVar63,auVar73);
          auVar51 = vmaxps_avx(auVar51,auVar64);
          fVar215 = auVar69._0_4_;
          auVar206._0_4_ = fVar215 * auVar65._0_4_;
          auVar206._4_4_ = fVar215 * auVar65._4_4_;
          auVar206._8_4_ = fVar215 * auVar65._8_4_;
          auVar206._12_4_ = fVar215 * auVar65._12_4_;
          auVar219._0_4_ = fVar215 * auVar51._0_4_;
          auVar219._4_4_ = fVar215 * auVar51._4_4_;
          auVar219._8_4_ = fVar215 * auVar51._8_4_;
          auVar219._12_4_ = fVar215 * auVar51._12_4_;
          auVar68 = vinsertps_avx512f(auVar49,auVar155,0x10);
          auVar73 = vinsertps_avx(auVar48,auVar156,0x10);
          auVar109._0_4_ = auVar68._0_4_ + auVar73._0_4_;
          auVar109._4_4_ = auVar68._4_4_ + auVar73._4_4_;
          auVar109._8_4_ = auVar68._8_4_ + auVar73._8_4_;
          auVar109._12_4_ = auVar68._12_4_ + auVar73._12_4_;
          auVar66 = vmulps_avx512vl(auVar109,auVar251._0_16_);
          auVar64 = vshufps_avx(auVar66,auVar66,0x54);
          uVar112 = auVar66._0_4_;
          auVar124._4_4_ = uVar112;
          auVar124._0_4_ = uVar112;
          auVar124._8_4_ = uVar112;
          auVar124._12_4_ = uVar112;
          auVar63 = vfmadd213ps_avx512vl(auVar57,auVar124,auVar3);
          auVar65 = vfmadd213ps_fma(auVar50,auVar124,auVar56);
          auVar62 = vfmadd213ps_fma(local_290,auVar124,auVar4);
          auVar51 = vsubps_avx(auVar65,auVar63);
          auVar63 = vfmadd213ps_fma(auVar51,auVar124,auVar63);
          auVar51 = vsubps_avx(auVar62,auVar65);
          auVar51 = vfmadd213ps_fma(auVar51,auVar124,auVar65);
          auVar51 = vsubps_avx(auVar51,auVar63);
          auVar65 = vfmadd231ps_fma(auVar63,auVar51,auVar124);
          auVar125._0_8_ = CONCAT44(auVar51._4_4_ * 3.0,auVar51._0_4_ * 3.0);
          auVar125._8_4_ = auVar51._8_4_ * 3.0;
          auVar125._12_4_ = auVar51._12_4_ * 3.0;
          auVar231._8_8_ = auVar65._0_8_;
          auVar231._0_8_ = auVar65._0_8_;
          auVar51 = vshufpd_avx(auVar65,auVar65,3);
          auVar65 = vshufps_avx(auVar66,auVar66,0x55);
          auVar62 = vsubps_avx(auVar51,auVar231);
          auVar63 = vfmadd231ps_fma(auVar231,auVar65,auVar62);
          auVar245._8_8_ = auVar125._0_8_;
          auVar245._0_8_ = auVar125._0_8_;
          auVar51 = vshufpd_avx(auVar125,auVar125,3);
          auVar51 = vsubps_avx(auVar51,auVar245);
          auVar65 = vfmadd213ps_fma(auVar51,auVar65,auVar245);
          auVar70 = vxorps_avx512vl(auVar62,auVar61);
          auVar51 = vmovshdup_avx(auVar65);
          auVar61 = vxorps_avx512vl(auVar51,auVar61);
          auVar71 = vmovshdup_avx512vl(auVar62);
          auVar61 = vpermt2ps_avx512vl(auVar61,ZEXT416(5),auVar62);
          auVar51 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar62._0_4_)),auVar65,
                                        auVar71);
          auVar65 = vpermt2ps_avx512vl(auVar65,SUB6416(ZEXT464(4),0),auVar70);
          auVar136._0_4_ = auVar51._0_4_;
          auVar136._4_4_ = auVar136._0_4_;
          auVar136._8_4_ = auVar136._0_4_;
          auVar136._12_4_ = auVar136._0_4_;
          auVar51 = vdivps_avx(auVar61,auVar136);
          auVar61 = vdivps_avx(auVar65,auVar136);
          fVar200 = auVar63._0_4_;
          auVar65 = vshufps_avx(auVar63,auVar63,0x55);
          fVar215 = auVar61._0_4_;
          auVar232._0_4_ = fVar200 * auVar51._0_4_ + auVar65._0_4_ * fVar215;
          auVar232._4_4_ = fVar200 * auVar51._4_4_ + auVar65._4_4_ * auVar61._4_4_;
          auVar232._8_4_ = fVar200 * auVar51._8_4_ + auVar65._8_4_ * auVar61._8_4_;
          auVar232._12_4_ = fVar200 * auVar51._12_4_ + auVar65._12_4_ * auVar61._12_4_;
          auVar67 = vsubps_avx(auVar64,auVar232);
          auVar62 = vmovshdup_avx(auVar51);
          auVar64 = vinsertps_avx(auVar184,auVar206,0x1c);
          auVar246._0_4_ = auVar62._0_4_ * auVar64._0_4_;
          auVar246._4_4_ = auVar62._4_4_ * auVar64._4_4_;
          auVar246._8_4_ = auVar62._8_4_ * auVar64._8_4_;
          auVar246._12_4_ = auVar62._12_4_ * auVar64._12_4_;
          auVar65 = vinsertps_avx(auVar171,auVar219,0x1c);
          auVar233._0_4_ = auVar62._0_4_ * auVar65._0_4_;
          auVar233._4_4_ = auVar62._4_4_ * auVar65._4_4_;
          auVar233._8_4_ = auVar62._8_4_ * auVar65._8_4_;
          auVar233._12_4_ = auVar62._12_4_ * auVar65._12_4_;
          auVar69 = vminps_avx512vl(auVar246,auVar233);
          auVar70 = vmaxps_avx(auVar233,auVar246);
          auVar71 = vmovshdup_avx(auVar61);
          auVar62 = vinsertps_avx(auVar206,auVar184,0x4c);
          auVar207._0_4_ = auVar71._0_4_ * auVar62._0_4_;
          auVar207._4_4_ = auVar71._4_4_ * auVar62._4_4_;
          auVar207._8_4_ = auVar71._8_4_ * auVar62._8_4_;
          auVar207._12_4_ = auVar71._12_4_ * auVar62._12_4_;
          auVar63 = vinsertps_avx(auVar219,auVar171,0x4c);
          auVar220._0_4_ = auVar71._0_4_ * auVar63._0_4_;
          auVar220._4_4_ = auVar71._4_4_ * auVar63._4_4_;
          auVar220._8_4_ = auVar71._8_4_ * auVar63._8_4_;
          auVar220._12_4_ = auVar71._12_4_ * auVar63._12_4_;
          auVar71 = vminps_avx(auVar207,auVar220);
          auVar69 = vaddps_avx512vl(auVar69,auVar71);
          auVar71 = vmaxps_avx(auVar220,auVar207);
          auVar208._0_4_ = auVar70._0_4_ + auVar71._0_4_;
          auVar208._4_4_ = auVar70._4_4_ + auVar71._4_4_;
          auVar208._8_4_ = auVar70._8_4_ + auVar71._8_4_;
          auVar208._12_4_ = auVar70._12_4_ + auVar71._12_4_;
          auVar221._8_8_ = 0x3f80000000000000;
          auVar221._0_8_ = 0x3f80000000000000;
          auVar70 = vsubps_avx(auVar221,auVar208);
          auVar71 = vsubps_avx(auVar221,auVar69);
          auVar69 = vsubps_avx(auVar68,auVar66);
          auVar66 = vsubps_avx(auVar73,auVar66);
          fVar214 = auVar69._0_4_;
          auVar247._0_4_ = fVar214 * auVar70._0_4_;
          fVar217 = auVar69._4_4_;
          auVar247._4_4_ = fVar217 * auVar70._4_4_;
          fVar235 = auVar69._8_4_;
          auVar247._8_4_ = fVar235 * auVar70._8_4_;
          fVar236 = auVar69._12_4_;
          auVar247._12_4_ = fVar236 * auVar70._12_4_;
          auVar72 = vbroadcastss_avx512vl(auVar51);
          auVar64 = vmulps_avx512vl(auVar72,auVar64);
          auVar65 = vmulps_avx512vl(auVar72,auVar65);
          auVar72 = vminps_avx512vl(auVar64,auVar65);
          auVar64 = vmaxps_avx(auVar65,auVar64);
          auVar185._0_4_ = fVar215 * auVar62._0_4_;
          auVar185._4_4_ = fVar215 * auVar62._4_4_;
          auVar185._8_4_ = fVar215 * auVar62._8_4_;
          auVar185._12_4_ = fVar215 * auVar62._12_4_;
          auVar172._0_4_ = fVar215 * auVar63._0_4_;
          auVar172._4_4_ = fVar215 * auVar63._4_4_;
          auVar172._8_4_ = fVar215 * auVar63._8_4_;
          auVar172._12_4_ = fVar215 * auVar63._12_4_;
          auVar65 = vminps_avx(auVar185,auVar172);
          auVar62 = vaddps_avx512vl(auVar72,auVar65);
          auVar63 = vmulps_avx512vl(auVar69,auVar71);
          fVar200 = auVar66._0_4_;
          auVar209._0_4_ = fVar200 * auVar70._0_4_;
          fVar211 = auVar66._4_4_;
          auVar209._4_4_ = fVar211 * auVar70._4_4_;
          fVar212 = auVar66._8_4_;
          auVar209._8_4_ = fVar212 * auVar70._8_4_;
          fVar213 = auVar66._12_4_;
          auVar209._12_4_ = fVar213 * auVar70._12_4_;
          auVar222._0_4_ = fVar200 * auVar71._0_4_;
          auVar222._4_4_ = fVar211 * auVar71._4_4_;
          auVar222._8_4_ = fVar212 * auVar71._8_4_;
          auVar222._12_4_ = fVar213 * auVar71._12_4_;
          auVar65 = vmaxps_avx(auVar172,auVar185);
          auVar173._0_4_ = auVar64._0_4_ + auVar65._0_4_;
          auVar173._4_4_ = auVar64._4_4_ + auVar65._4_4_;
          auVar173._8_4_ = auVar64._8_4_ + auVar65._8_4_;
          auVar173._12_4_ = auVar64._12_4_ + auVar65._12_4_;
          auVar186._8_8_ = 0x3f800000;
          auVar186._0_8_ = 0x3f800000;
          auVar64 = vsubps_avx(auVar186,auVar173);
          auVar65 = vsubps_avx(auVar186,auVar62);
          auVar241._0_4_ = fVar214 * auVar64._0_4_;
          auVar241._4_4_ = fVar217 * auVar64._4_4_;
          auVar241._8_4_ = fVar235 * auVar64._8_4_;
          auVar241._12_4_ = fVar236 * auVar64._12_4_;
          auVar234._0_4_ = fVar214 * auVar65._0_4_;
          auVar234._4_4_ = fVar217 * auVar65._4_4_;
          auVar234._8_4_ = fVar235 * auVar65._8_4_;
          auVar234._12_4_ = fVar236 * auVar65._12_4_;
          auVar174._0_4_ = fVar200 * auVar64._0_4_;
          auVar174._4_4_ = fVar211 * auVar64._4_4_;
          auVar174._8_4_ = fVar212 * auVar64._8_4_;
          auVar174._12_4_ = fVar213 * auVar64._12_4_;
          auVar187._0_4_ = fVar200 * auVar65._0_4_;
          auVar187._4_4_ = fVar211 * auVar65._4_4_;
          auVar187._8_4_ = fVar212 * auVar65._8_4_;
          auVar187._12_4_ = fVar213 * auVar65._12_4_;
          auVar64 = vminps_avx(auVar241,auVar234);
          auVar65 = vminps_avx(auVar174,auVar187);
          auVar62 = vminps_avx(auVar64,auVar65);
          auVar64 = vmaxps_avx(auVar234,auVar241);
          auVar65 = vmaxps_avx(auVar187,auVar174);
          auVar65 = vmaxps_avx(auVar65,auVar64);
          auVar70 = vminps_avx512vl(auVar247,auVar63);
          auVar64 = vminps_avx(auVar209,auVar222);
          auVar64 = vminps_avx(auVar70,auVar64);
          auVar64 = vhaddps_avx(auVar62,auVar64);
          auVar63 = vmaxps_avx512vl(auVar63,auVar247);
          auVar62 = vmaxps_avx(auVar222,auVar209);
          auVar62 = vmaxps_avx(auVar62,auVar63);
          auVar65 = vhaddps_avx(auVar65,auVar62);
          auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
          auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
          auVar175._0_4_ = auVar64._0_4_ + auVar67._0_4_;
          auVar175._4_4_ = auVar64._4_4_ + auVar67._4_4_;
          auVar175._8_4_ = auVar64._8_4_ + auVar67._8_4_;
          auVar175._12_4_ = auVar64._12_4_ + auVar67._12_4_;
          auVar188._0_4_ = auVar65._0_4_ + auVar67._0_4_;
          auVar188._4_4_ = auVar65._4_4_ + auVar67._4_4_;
          auVar188._8_4_ = auVar65._8_4_ + auVar67._8_4_;
          auVar188._12_4_ = auVar65._12_4_ + auVar67._12_4_;
          auVar64 = vmaxps_avx(auVar68,auVar175);
          auVar65 = vminps_avx(auVar188,auVar73);
          uVar42 = vcmpps_avx512vl(auVar65,auVar64,1);
          auVar64 = vinsertps_avx(auVar155,auVar156,0x10);
          auVar250 = ZEXT1664(auVar64);
          auVar65 = ZEXT416(5);
          if ((uVar42 & 3) == 0) {
            vucomiss_avx512f(auVar49);
            auVar65 = vxorps_avx512vl(auVar65,auVar65);
            auVar259 = ZEXT1664(auVar65);
            local_480 = auVar55._0_4_;
            fStack_47c = auVar55._4_4_;
            fStack_478 = auVar55._8_4_;
            fStack_474 = auVar55._12_4_;
            if ((uint)uVar37 < 4 && (uVar7 == 0 || lVar41 == 0)) {
              bVar20 = false;
            }
            else {
              lVar41 = 200;
              do {
                auVar73 = vsubss_avx512f(auVar60,auVar67);
                fVar212 = auVar73._0_4_;
                fVar200 = fVar212 * fVar212 * fVar212;
                fVar213 = auVar67._0_4_;
                fVar211 = fVar213 * 3.0 * fVar212 * fVar212;
                fVar212 = fVar212 * fVar213 * fVar213 * 3.0;
                auVar153._4_4_ = fVar200;
                auVar153._0_4_ = fVar200;
                auVar153._8_4_ = fVar200;
                auVar153._12_4_ = fVar200;
                auVar143._4_4_ = fVar211;
                auVar143._0_4_ = fVar211;
                auVar143._8_4_ = fVar211;
                auVar143._12_4_ = fVar211;
                auVar117._4_4_ = fVar212;
                auVar117._0_4_ = fVar212;
                auVar117._8_4_ = fVar212;
                auVar117._12_4_ = fVar212;
                fVar213 = fVar213 * fVar213 * fVar213;
                auVar158._0_4_ = local_480 * fVar213;
                auVar158._4_4_ = fStack_47c * fVar213;
                auVar158._8_4_ = fStack_478 * fVar213;
                auVar158._12_4_ = fStack_474 * fVar213;
                auVar73 = vfmadd231ps_fma(auVar158,auVar4,auVar117);
                auVar73 = vfmadd231ps_fma(auVar73,auVar56,auVar143);
                auVar73 = vfmadd231ps_fma(auVar73,auVar3,auVar153);
                auVar118._8_8_ = auVar73._0_8_;
                auVar118._0_8_ = auVar73._0_8_;
                auVar73 = vshufpd_avx(auVar73,auVar73,3);
                auVar62 = vshufps_avx(auVar67,auVar67,0x55);
                auVar73 = vsubps_avx(auVar73,auVar118);
                auVar62 = vfmadd213ps_fma(auVar73,auVar62,auVar118);
                fVar200 = auVar62._0_4_;
                auVar73 = vshufps_avx(auVar62,auVar62,0x55);
                auVar119._0_4_ = auVar51._0_4_ * fVar200 + fVar215 * auVar73._0_4_;
                auVar119._4_4_ = auVar51._4_4_ * fVar200 + auVar61._4_4_ * auVar73._4_4_;
                auVar119._8_4_ = auVar51._8_4_ * fVar200 + auVar61._8_4_ * auVar73._8_4_;
                auVar119._12_4_ = auVar51._12_4_ * fVar200 + auVar61._12_4_ * auVar73._12_4_;
                auVar67 = vsubps_avx(auVar67,auVar119);
                auVar73 = vandps_avx512vl(auVar62,auVar253._0_16_);
                auVar62 = vprolq_avx512vl(auVar73,0x20);
                auVar73 = vmaxss_avx(auVar62,auVar73);
                bVar46 = auVar73._0_4_ <= fVar108;
                if (auVar73._0_4_ < fVar108) {
                  auVar51 = vucomiss_avx512f(auVar65);
                  if (bVar46) {
                    auVar60 = vucomiss_avx512f(auVar51);
                    auVar254 = ZEXT1664(auVar60);
                    if (bVar46) {
                      vmovshdup_avx(auVar51);
                      auVar60 = vucomiss_avx512f(auVar65);
                      if (bVar46) {
                        auVar61 = vucomiss_avx512f(auVar60);
                        auVar254 = ZEXT1664(auVar61);
                        if (bVar46) {
                          auVar73 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar67 = vinsertps_avx(auVar73,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar73 = vdpps_avx(auVar67,local_2a0,0x7f);
                          auVar62 = vdpps_avx(auVar67,local_2b0,0x7f);
                          auVar63 = vdpps_avx(auVar67,local_2c0,0x7f);
                          auVar70 = vdpps_avx(auVar67,local_2d0,0x7f);
                          auVar71 = vdpps_avx(auVar67,local_2e0,0x7f);
                          auVar69 = vdpps_avx(auVar67,local_2f0,0x7f);
                          auVar66 = vdpps_avx(auVar67,local_300,0x7f);
                          auVar67 = vdpps_avx(auVar67,local_310,0x7f);
                          auVar68 = vsubss_avx512f(auVar61,auVar60);
                          fVar215 = auVar60._0_4_;
                          auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar71._0_4_)),auVar68
                                                    ,auVar73);
                          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * fVar215)),auVar68
                                                    ,auVar62);
                          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar215)),auVar68
                                                    ,auVar63);
                          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar67._0_4_)),auVar68
                                                    ,auVar70);
                          auVar61 = vsubss_avx512f(auVar61,auVar51);
                          auVar159._0_4_ = auVar61._0_4_;
                          fVar215 = auVar159._0_4_ * auVar159._0_4_ * auVar159._0_4_;
                          local_120 = auVar51._0_4_;
                          fVar200 = local_120 * 3.0 * auVar159._0_4_ * auVar159._0_4_;
                          fVar211 = auVar159._0_4_ * local_120 * local_120 * 3.0;
                          fVar213 = local_120 * local_120 * local_120;
                          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar63._0_4_)),
                                                    ZEXT416((uint)fVar211),auVar62);
                          auVar61 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar200),auVar73);
                          auVar60 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar215),auVar60);
                          fVar212 = auVar60._0_4_;
                          if ((fVar216 <= fVar212) &&
                             (fVar214 = *(float *)(ray + k * 4 + 0x100), fVar212 <= fVar214)) {
                            auVar60 = vshufps_avx(auVar51,auVar51,0x55);
                            auVar73 = vsubps_avx512vl(auVar47,auVar60);
                            fVar217 = auVar60._0_4_;
                            auVar196._0_4_ = fVar217 * (float)local_330._0_4_;
                            fVar235 = auVar60._4_4_;
                            auVar196._4_4_ = fVar235 * (float)local_330._4_4_;
                            fVar236 = auVar60._8_4_;
                            auVar196._8_4_ = fVar236 * fStack_328;
                            fVar237 = auVar60._12_4_;
                            auVar196._12_4_ = fVar237 * fStack_324;
                            auVar210._0_4_ = fVar217 * (float)local_380._0_4_;
                            auVar210._4_4_ = fVar235 * (float)local_380._4_4_;
                            auVar210._8_4_ = fVar236 * fStack_378;
                            auVar210._12_4_ = fVar237 * fStack_374;
                            auVar223._0_4_ = fVar217 * (float)local_390._0_4_;
                            auVar223._4_4_ = fVar235 * (float)local_390._4_4_;
                            auVar223._8_4_ = fVar236 * fStack_388;
                            auVar223._12_4_ = fVar237 * fStack_384;
                            auVar176._0_4_ = fVar217 * (float)local_350._0_4_;
                            auVar176._4_4_ = fVar235 * (float)local_350._4_4_;
                            auVar176._8_4_ = fVar236 * fStack_348;
                            auVar176._12_4_ = fVar237 * fStack_344;
                            auVar47 = vfmadd231ps_fma(auVar196,auVar73,local_320);
                            auVar60 = vfmadd231ps_fma(auVar210,auVar73,local_360);
                            auVar61 = vfmadd231ps_fma(auVar223,auVar73,local_370);
                            auVar73 = vfmadd231ps_fma(auVar176,auVar73,local_340);
                            auVar47 = vsubps_avx(auVar60,auVar47);
                            auVar60 = vsubps_avx(auVar61,auVar60);
                            auVar61 = vsubps_avx(auVar73,auVar61);
                            auVar224._0_4_ = local_120 * auVar60._0_4_;
                            auVar224._4_4_ = local_120 * auVar60._4_4_;
                            auVar224._8_4_ = local_120 * auVar60._8_4_;
                            auVar224._12_4_ = local_120 * auVar60._12_4_;
                            auVar159._4_4_ = auVar159._0_4_;
                            auVar159._8_4_ = auVar159._0_4_;
                            auVar159._12_4_ = auVar159._0_4_;
                            auVar47 = vfmadd231ps_fma(auVar224,auVar159,auVar47);
                            auVar177._0_4_ = local_120 * auVar61._0_4_;
                            auVar177._4_4_ = local_120 * auVar61._4_4_;
                            auVar177._8_4_ = local_120 * auVar61._8_4_;
                            auVar177._12_4_ = local_120 * auVar61._12_4_;
                            auVar60 = vfmadd231ps_fma(auVar177,auVar159,auVar60);
                            auVar178._0_4_ = local_120 * auVar60._0_4_;
                            auVar178._4_4_ = local_120 * auVar60._4_4_;
                            auVar178._8_4_ = local_120 * auVar60._8_4_;
                            auVar178._12_4_ = local_120 * auVar60._12_4_;
                            auVar47 = vfmadd231ps_fma(auVar178,auVar159,auVar47);
                            auVar22._8_4_ = 0x40400000;
                            auVar22._0_8_ = 0x4040000040400000;
                            auVar22._12_4_ = 0x40400000;
                            auVar47 = vmulps_avx512vl(auVar47,auVar22);
                            pGVar8 = (context->scene->geometries).items[uVar43].ptr;
                            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                              bVar46 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar46 = true,
                                    pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar154._0_4_ = fVar213 * (float)local_3d0._0_4_;
                              auVar154._4_4_ = fVar213 * (float)local_3d0._4_4_;
                              auVar154._8_4_ = fVar213 * fStack_3c8;
                              auVar154._12_4_ = fVar213 * fStack_3c4;
                              auVar144._4_4_ = fVar211;
                              auVar144._0_4_ = fVar211;
                              auVar144._8_4_ = fVar211;
                              auVar144._12_4_ = fVar211;
                              auVar60 = vfmadd132ps_fma(auVar144,auVar154,local_3c0);
                              auVar137._4_4_ = fVar200;
                              auVar137._0_4_ = fVar200;
                              auVar137._8_4_ = fVar200;
                              auVar137._12_4_ = fVar200;
                              auVar60 = vfmadd132ps_fma(auVar137,auVar60,local_3b0);
                              auVar126._4_4_ = fVar215;
                              auVar126._0_4_ = fVar215;
                              auVar126._8_4_ = fVar215;
                              auVar126._12_4_ = fVar215;
                              auVar73 = vfmadd132ps_fma(auVar126,auVar60,local_3a0);
                              auVar60 = vshufps_avx(auVar73,auVar73,0xc9);
                              auVar61 = vshufps_avx(auVar47,auVar47,0xc9);
                              auVar127._0_4_ = auVar73._0_4_ * auVar61._0_4_;
                              auVar127._4_4_ = auVar73._4_4_ * auVar61._4_4_;
                              auVar127._8_4_ = auVar73._8_4_ * auVar61._8_4_;
                              auVar127._12_4_ = auVar73._12_4_ * auVar61._12_4_;
                              auVar47 = vfmsub231ps_fma(auVar127,auVar47,auVar60);
                              auVar147._8_4_ = 1;
                              auVar147._0_8_ = 0x100000001;
                              auVar147._12_4_ = 1;
                              auVar147._16_4_ = 1;
                              auVar147._20_4_ = 1;
                              auVar147._24_4_ = 1;
                              auVar147._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar147,ZEXT1632(auVar51));
                              auVar80 = vpermps_avx2(auVar147,ZEXT1632(auVar47));
                              local_160 = vpermps_avx512vl(auVar256._0_32_,ZEXT1632(auVar47));
                              local_140 = auVar47._0_4_;
                              local_180[0] = (RTCHitN)auVar80[0];
                              local_180[1] = (RTCHitN)auVar80[1];
                              local_180[2] = (RTCHitN)auVar80[2];
                              local_180[3] = (RTCHitN)auVar80[3];
                              local_180[4] = (RTCHitN)auVar80[4];
                              local_180[5] = (RTCHitN)auVar80[5];
                              local_180[6] = (RTCHitN)auVar80[6];
                              local_180[7] = (RTCHitN)auVar80[7];
                              local_180[8] = (RTCHitN)auVar80[8];
                              local_180[9] = (RTCHitN)auVar80[9];
                              local_180[10] = (RTCHitN)auVar80[10];
                              local_180[0xb] = (RTCHitN)auVar80[0xb];
                              local_180[0xc] = (RTCHitN)auVar80[0xc];
                              local_180[0xd] = (RTCHitN)auVar80[0xd];
                              local_180[0xe] = (RTCHitN)auVar80[0xe];
                              local_180[0xf] = (RTCHitN)auVar80[0xf];
                              local_180[0x10] = (RTCHitN)auVar80[0x10];
                              local_180[0x11] = (RTCHitN)auVar80[0x11];
                              local_180[0x12] = (RTCHitN)auVar80[0x12];
                              local_180[0x13] = (RTCHitN)auVar80[0x13];
                              local_180[0x14] = (RTCHitN)auVar80[0x14];
                              local_180[0x15] = (RTCHitN)auVar80[0x15];
                              local_180[0x16] = (RTCHitN)auVar80[0x16];
                              local_180[0x17] = (RTCHitN)auVar80[0x17];
                              local_180[0x18] = (RTCHitN)auVar80[0x18];
                              local_180[0x19] = (RTCHitN)auVar80[0x19];
                              local_180[0x1a] = (RTCHitN)auVar80[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar80[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar80[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar80[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar80[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar80[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_220._0_8_;
                              uStack_d8 = local_220._8_8_;
                              uStack_d0 = local_220._16_8_;
                              uStack_c8 = local_220._24_8_;
                              local_c0 = local_240;
                              vpcmpeqd_avx2(local_240,local_240);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar212;
                              local_400 = local_260._0_8_;
                              uStack_3f8 = local_260._8_8_;
                              uStack_3f0 = local_260._16_8_;
                              uStack_3e8 = local_260._24_8_;
                              local_430.valid = (int *)&local_400;
                              local_430.geometryUserPtr = pGVar8->userPtr;
                              local_430.context = context->user;
                              local_430.ray = (RTCRayN *)ray;
                              local_430.hit = local_180;
                              local_430.N = 8;
                              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->occlusionFilterN)(&local_430);
                                auVar47 = vxorps_avx512vl(auVar65,auVar65);
                                auVar259 = ZEXT1664(auVar47);
                                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar255 = ZEXT1664(auVar47);
                                auVar254 = ZEXT464(0x3f800000);
                                auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar252 = ZEXT3264(auVar80);
                                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar253 = ZEXT1664(auVar47);
                                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar251 = ZEXT1664(auVar47);
                                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar257 = ZEXT1664(auVar47);
                                auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar256 = ZEXT3264(auVar80);
                              }
                              auVar47 = auVar259._0_16_;
                              auVar33._8_8_ = uStack_3f8;
                              auVar33._0_8_ = local_400;
                              auVar33._16_8_ = uStack_3f0;
                              auVar33._24_8_ = uStack_3e8;
                              if (auVar33 == (undefined1  [32])0x0) {
                                bVar46 = false;
                              }
                              else {
                                p_Var9 = context->args->filter;
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var9)(&local_430);
                                  auVar47 = vxorps_avx512vl(auVar47,auVar47);
                                  auVar259 = ZEXT1664(auVar47);
                                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar255 = ZEXT1664(auVar47);
                                  auVar254 = ZEXT464(0x3f800000);
                                  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar252 = ZEXT3264(auVar80);
                                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar253 = ZEXT1664(auVar47);
                                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar251 = ZEXT1664(auVar47);
                                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar257 = ZEXT1664(auVar47);
                                  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar256 = ZEXT3264(auVar80);
                                }
                                auVar34._8_8_ = uStack_3f8;
                                auVar34._0_8_ = local_400;
                                auVar34._16_8_ = uStack_3f0;
                                auVar34._24_8_ = uStack_3e8;
                                uVar42 = vptestmd_avx512vl(auVar34,auVar34);
                                auVar80 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar46 = (bool)((byte)uVar42 & 1);
                                bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar13 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar14 = (bool)((byte)(uVar42 >> 3) & 1);
                                bVar15 = (bool)((byte)(uVar42 >> 4) & 1);
                                bVar16 = (bool)((byte)(uVar42 >> 5) & 1);
                                bVar17 = (bool)((byte)(uVar42 >> 6) & 1);
                                bVar18 = SUB81(uVar42 >> 7,0);
                                *(uint *)(local_430.ray + 0x100) =
                                     (uint)bVar46 * auVar80._0_4_ |
                                     (uint)!bVar46 * *(int *)(local_430.ray + 0x100);
                                *(uint *)(local_430.ray + 0x104) =
                                     (uint)bVar12 * auVar80._4_4_ |
                                     (uint)!bVar12 * *(int *)(local_430.ray + 0x104);
                                *(uint *)(local_430.ray + 0x108) =
                                     (uint)bVar13 * auVar80._8_4_ |
                                     (uint)!bVar13 * *(int *)(local_430.ray + 0x108);
                                *(uint *)(local_430.ray + 0x10c) =
                                     (uint)bVar14 * auVar80._12_4_ |
                                     (uint)!bVar14 * *(int *)(local_430.ray + 0x10c);
                                *(uint *)(local_430.ray + 0x110) =
                                     (uint)bVar15 * auVar80._16_4_ |
                                     (uint)!bVar15 * *(int *)(local_430.ray + 0x110);
                                *(uint *)(local_430.ray + 0x114) =
                                     (uint)bVar16 * auVar80._20_4_ |
                                     (uint)!bVar16 * *(int *)(local_430.ray + 0x114);
                                *(uint *)(local_430.ray + 0x118) =
                                     (uint)bVar17 * auVar80._24_4_ |
                                     (uint)!bVar17 * *(int *)(local_430.ray + 0x118);
                                *(uint *)(local_430.ray + 0x11c) =
                                     (uint)bVar18 * auVar80._28_4_ |
                                     (uint)!bVar18 * *(int *)(local_430.ray + 0x11c);
                                bVar46 = auVar34 != (undefined1  [32])0x0;
                              }
                              if (!bVar46) {
                                *(float *)(ray + k * 4 + 0x100) = fVar214;
                              }
                            }
                            auVar250 = ZEXT1664(auVar64);
                            bVar45 = (bool)(bVar45 | bVar46);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar41 = lVar41 + -1;
              } while (lVar41 != 0);
            }
          }
          else {
            auVar47 = vxorps_avx512vl(ZEXT416(5),auVar65);
            auVar259 = ZEXT1664(auVar47);
          }
        }
      }
    } while (bVar20);
    auVar47 = vinsertps_avx512f(auVar49,auVar48,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }